

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O1

int gladLoadGLLoader(GLADloadproc load)

{
  byte *__haystack;
  bool bVar1;
  byte *pbVar2;
  char **ppcVar3;
  int iVar4;
  uint uVar5;
  GLubyte *pGVar6;
  size_t sVar7;
  char *pcVar8;
  byte *pbVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  bool bVar16;
  bool bVar17;
  int minor;
  int major;
  int local_38;
  int local_34;
  
  GLVersion.major = 0;
  GLVersion.minor = 0;
  glad_glGetString = (PFNGLGETSTRINGPROC)(*load)("glGetString");
  if (glad_glGetString == (PFNGLGETSTRINGPROC)0x0) {
    return 0;
  }
  pGVar6 = (*glad_glGetString)(0x1f02);
  if (pGVar6 == (GLubyte *)0x0) {
    return 0;
  }
  pGVar6 = (*glad_glGetString)(0x1f02);
  if (pGVar6 != (GLubyte *)0x0) {
    lVar15 = 0;
    do {
      pcVar8 = *(char **)((long)&PTR_anon_var_dwarf_42de7_001984f0 + lVar15);
      sVar7 = strlen(pcVar8);
      iVar4 = strncmp((char *)pGVar6,pcVar8,sVar7);
      if (iVar4 != 0) {
        sVar7 = 0;
      }
      pGVar6 = pGVar6 + sVar7;
    } while ((iVar4 != 0) && (bVar16 = lVar15 != 0x10, lVar15 = lVar15 + 8, bVar16));
    __isoc99_sscanf(pGVar6,"%d.%d",&local_34,&local_38);
    bVar16 = 4 < local_34;
    uVar5 = (uint)bVar16;
    uVar11 = (uint)(1 < local_34);
    GLAD_GL_VERSION_4_5 = uVar5;
    GLAD_GL_VERSION_1_5 = uVar11;
    if (4 < local_38) {
      GLAD_GL_VERSION_1_5 = 1;
      GLAD_GL_VERSION_4_5 = 1;
    }
    if (local_34 != 4) {
      GLAD_GL_VERSION_4_5 = uVar5;
    }
    GLAD_GL_VERSION_4_4 = uVar5;
    GLAD_GL_VERSION_1_4 = uVar11;
    if (3 < local_38) {
      GLAD_GL_VERSION_1_4 = 1;
      GLAD_GL_VERSION_4_4 = 1;
    }
    bVar1 = 3 < local_34;
    GLAD_GL_VERSION_3_1 = (int)bVar1;
    if (local_34 != 4) {
      GLAD_GL_VERSION_4_4 = uVar5;
    }
    GLAD_GL_VERSION_1_3 = uVar11;
    if (2 < local_38) {
      GLAD_GL_VERSION_1_3 = 1;
    }
    uVar10 = (uint)bVar1;
    GLAD_GL_VERSION_4_3 = uVar5;
    GLAD_GL_VERSION_3_3 = uVar10;
    if (2 < local_38) {
      GLAD_GL_VERSION_3_3 = 1;
      GLAD_GL_VERSION_4_3 = 1;
    }
    if (local_34 != 4) {
      GLAD_GL_VERSION_4_3 = uVar5;
    }
    GLAD_GL_VERSION_4_2 = uVar5;
    GLAD_GL_VERSION_3_2 = uVar10;
    GLAD_GL_VERSION_1_2 = uVar11;
    if (1 < local_38) {
      GLAD_GL_VERSION_1_2 = 1;
      GLAD_GL_VERSION_3_2 = 1;
      GLAD_GL_VERSION_4_2 = 1;
    }
    if (local_34 != 4) {
      GLAD_GL_VERSION_4_2 = uVar5;
    }
    uVar14 = (uint)(2 < local_34);
    if (local_34 != 3) {
      GLAD_GL_VERSION_3_2 = uVar10;
    }
    bVar17 = -1 < local_38;
    GLAD_GL_VERSION_1_0 = uVar11;
    if (bVar17) {
      GLAD_GL_VERSION_1_0 = 1;
    }
    GLAD_GL_VERSION_1_1 = uVar11;
    if (0 < local_38) {
      GLAD_GL_VERSION_1_1 = 1;
    }
    GLAD_GL_VERSION_2_0 = uVar14;
    if (bVar17) {
      GLAD_GL_VERSION_2_0 = 1;
    }
    GLAD_GL_VERSION_2_1 = uVar14;
    if (0 < local_38) {
      GLAD_GL_VERSION_2_1 = 1;
    }
    GLAD_GL_VERSION_3_0 = GLAD_GL_VERSION_3_1;
    if (bVar17) {
      GLAD_GL_VERSION_3_0 = 1;
    }
    if (0 < local_38) {
      GLAD_GL_VERSION_3_1 = 1;
    }
    GLAD_GL_VERSION_4_0 = uVar5;
    if (bVar17) {
      GLAD_GL_VERSION_4_0 = 1;
    }
    GLAD_GL_VERSION_4_1 = uVar5;
    if (0 < local_38) {
      GLAD_GL_VERSION_4_1 = 1;
    }
    bVar17 = local_34 == 4;
    if (!bVar17) {
      GLAD_GL_VERSION_4_1 = uVar5;
      GLAD_GL_VERSION_4_0 = uVar5;
    }
    if (local_34 != 3) {
      GLAD_GL_VERSION_3_3 = (uint)bVar1;
      GLAD_GL_VERSION_3_0 = uVar10;
      GLAD_GL_VERSION_3_1 = uVar10;
    }
    if (local_34 != 2) {
      GLAD_GL_VERSION_2_1 = uVar14;
      GLAD_GL_VERSION_2_0 = uVar14;
    }
    max_loaded_major = local_34;
    if (local_34 != 1) {
      GLAD_GL_VERSION_1_5 = uVar11;
      GLAD_GL_VERSION_1_3 = uVar11;
      GLAD_GL_VERSION_1_1 = uVar11;
      GLAD_GL_VERSION_1_0 = uVar11;
      GLAD_GL_VERSION_1_2 = uVar11;
      GLAD_GL_VERSION_1_4 = uVar11;
    }
    GLVersion.minor = local_38;
    GLVersion.major = local_34;
    GLAD_GL_VERSION_4_6 = 1;
    if (5 >= local_38 || !bVar17) {
      GLAD_GL_VERSION_4_6 = (uint)bVar16;
    }
    if (bVar16 || 5 < local_38 && bVar17) {
      max_loaded_major = 4;
    }
  }
  if (GLAD_GL_VERSION_1_0 != 0) {
    glad_glCullFace = (PFNGLCULLFACEPROC)(*load)("glCullFace");
    glad_glFrontFace = (PFNGLFRONTFACEPROC)(*load)("glFrontFace");
    glad_glHint = (PFNGLHINTPROC)(*load)("glHint");
    glad_glLineWidth = (PFNGLLINEWIDTHPROC)(*load)("glLineWidth");
    glad_glPointSize = (PFNGLPOINTSIZEPROC)(*load)("glPointSize");
    glad_glPolygonMode = (PFNGLPOLYGONMODEPROC)(*load)("glPolygonMode");
    glad_glScissor = (PFNGLSCISSORPROC)(*load)("glScissor");
    glad_glTexParameterf = (PFNGLTEXPARAMETERFPROC)(*load)("glTexParameterf");
    glad_glTexParameterfv = (PFNGLTEXPARAMETERFVPROC)(*load)("glTexParameterfv");
    glad_glTexParameteri = (PFNGLTEXPARAMETERIPROC)(*load)("glTexParameteri");
    glad_glTexParameteriv = (PFNGLTEXPARAMETERIVPROC)(*load)("glTexParameteriv");
    glad_glTexImage1D = (PFNGLTEXIMAGE1DPROC)(*load)("glTexImage1D");
    glad_glTexImage2D = (PFNGLTEXIMAGE2DPROC)(*load)("glTexImage2D");
    glad_glDrawBuffer = (PFNGLDRAWBUFFERPROC)(*load)("glDrawBuffer");
    glad_glClear = (PFNGLCLEARPROC)(*load)("glClear");
    glad_glClearColor = (PFNGLCLEARCOLORPROC)(*load)("glClearColor");
    glad_glClearStencil = (PFNGLCLEARSTENCILPROC)(*load)("glClearStencil");
    glad_glClearDepth = (PFNGLCLEARDEPTHPROC)(*load)("glClearDepth");
    glad_glStencilMask = (PFNGLSTENCILMASKPROC)(*load)("glStencilMask");
    glad_glColorMask = (PFNGLCOLORMASKPROC)(*load)("glColorMask");
    glad_glDepthMask = (PFNGLDEPTHMASKPROC)(*load)("glDepthMask");
    glad_glDisable = (PFNGLDISABLEPROC)(*load)("glDisable");
    glad_glEnable = (PFNGLENABLEPROC)(*load)("glEnable");
    glad_glFinish = (PFNGLFINISHPROC)(*load)("glFinish");
    glad_glFlush = (PFNGLFLUSHPROC)(*load)("glFlush");
    glad_glBlendFunc = (PFNGLBLENDFUNCPROC)(*load)("glBlendFunc");
    glad_glLogicOp = (PFNGLLOGICOPPROC)(*load)("glLogicOp");
    glad_glStencilFunc = (PFNGLSTENCILFUNCPROC)(*load)("glStencilFunc");
    glad_glStencilOp = (PFNGLSTENCILOPPROC)(*load)("glStencilOp");
    glad_glDepthFunc = (PFNGLDEPTHFUNCPROC)(*load)("glDepthFunc");
    glad_glPixelStoref = (PFNGLPIXELSTOREFPROC)(*load)("glPixelStoref");
    glad_glPixelStorei = (PFNGLPIXELSTOREIPROC)(*load)("glPixelStorei");
    glad_glReadBuffer = (PFNGLREADBUFFERPROC)(*load)("glReadBuffer");
    glad_glReadPixels = (PFNGLREADPIXELSPROC)(*load)("glReadPixels");
    glad_glGetBooleanv = (PFNGLGETBOOLEANVPROC)(*load)("glGetBooleanv");
    glad_glGetDoublev = (PFNGLGETDOUBLEVPROC)(*load)("glGetDoublev");
    glad_glGetError = (PFNGLGETERRORPROC)(*load)("glGetError");
    glad_glGetFloatv = (PFNGLGETFLOATVPROC)(*load)("glGetFloatv");
    glad_glGetIntegerv = (PFNGLGETINTEGERVPROC)(*load)("glGetIntegerv");
    glad_glGetString = (PFNGLGETSTRINGPROC)(*load)("glGetString");
    glad_glGetTexImage = (PFNGLGETTEXIMAGEPROC)(*load)("glGetTexImage");
    glad_glGetTexParameterfv = (PFNGLGETTEXPARAMETERFVPROC)(*load)("glGetTexParameterfv");
    glad_glGetTexParameteriv = (PFNGLGETTEXPARAMETERIVPROC)(*load)("glGetTexParameteriv");
    glad_glGetTexLevelParameterfv =
         (PFNGLGETTEXLEVELPARAMETERFVPROC)(*load)("glGetTexLevelParameterfv");
    glad_glGetTexLevelParameteriv =
         (PFNGLGETTEXLEVELPARAMETERIVPROC)(*load)("glGetTexLevelParameteriv");
    glad_glIsEnabled = (PFNGLISENABLEDPROC)(*load)("glIsEnabled");
    glad_glDepthRange = (PFNGLDEPTHRANGEPROC)(*load)("glDepthRange");
    glad_glViewport = (PFNGLVIEWPORTPROC)(*load)("glViewport");
  }
  if (GLAD_GL_VERSION_1_1 != 0) {
    glad_glDrawArrays = (PFNGLDRAWARRAYSPROC)(*load)("glDrawArrays");
    glad_glDrawElements = (PFNGLDRAWELEMENTSPROC)(*load)("glDrawElements");
    glad_glPolygonOffset = (PFNGLPOLYGONOFFSETPROC)(*load)("glPolygonOffset");
    glad_glCopyTexImage1D = (PFNGLCOPYTEXIMAGE1DPROC)(*load)("glCopyTexImage1D");
    glad_glCopyTexImage2D = (PFNGLCOPYTEXIMAGE2DPROC)(*load)("glCopyTexImage2D");
    glad_glCopyTexSubImage1D = (PFNGLCOPYTEXSUBIMAGE1DPROC)(*load)("glCopyTexSubImage1D");
    glad_glCopyTexSubImage2D = (PFNGLCOPYTEXSUBIMAGE2DPROC)(*load)("glCopyTexSubImage2D");
    glad_glTexSubImage1D = (PFNGLTEXSUBIMAGE1DPROC)(*load)("glTexSubImage1D");
    glad_glTexSubImage2D = (PFNGLTEXSUBIMAGE2DPROC)(*load)("glTexSubImage2D");
    glad_glBindTexture = (PFNGLBINDTEXTUREPROC)(*load)("glBindTexture");
    glad_glDeleteTextures = (PFNGLDELETETEXTURESPROC)(*load)("glDeleteTextures");
    glad_glGenTextures = (PFNGLGENTEXTURESPROC)(*load)("glGenTextures");
    glad_glIsTexture = (PFNGLISTEXTUREPROC)(*load)("glIsTexture");
  }
  if (GLAD_GL_VERSION_1_2 != 0) {
    glad_glDrawRangeElements = (PFNGLDRAWRANGEELEMENTSPROC)(*load)("glDrawRangeElements");
    glad_glTexImage3D = (PFNGLTEXIMAGE3DPROC)(*load)("glTexImage3D");
    glad_glTexSubImage3D = (PFNGLTEXSUBIMAGE3DPROC)(*load)("glTexSubImage3D");
    glad_glCopyTexSubImage3D = (PFNGLCOPYTEXSUBIMAGE3DPROC)(*load)("glCopyTexSubImage3D");
  }
  if (GLAD_GL_VERSION_1_3 != 0) {
    glad_glActiveTexture = (PFNGLACTIVETEXTUREPROC)(*load)("glActiveTexture");
    glad_glSampleCoverage = (PFNGLSAMPLECOVERAGEPROC)(*load)("glSampleCoverage");
    glad_glCompressedTexImage3D = (PFNGLCOMPRESSEDTEXIMAGE3DPROC)(*load)("glCompressedTexImage3D");
    glad_glCompressedTexImage2D = (PFNGLCOMPRESSEDTEXIMAGE2DPROC)(*load)("glCompressedTexImage2D");
    glad_glCompressedTexImage1D = (PFNGLCOMPRESSEDTEXIMAGE1DPROC)(*load)("glCompressedTexImage1D");
    glad_glCompressedTexSubImage3D =
         (PFNGLCOMPRESSEDTEXSUBIMAGE3DPROC)(*load)("glCompressedTexSubImage3D");
    glad_glCompressedTexSubImage2D =
         (PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC)(*load)("glCompressedTexSubImage2D");
    glad_glCompressedTexSubImage1D =
         (PFNGLCOMPRESSEDTEXSUBIMAGE1DPROC)(*load)("glCompressedTexSubImage1D");
    glad_glGetCompressedTexImage =
         (PFNGLGETCOMPRESSEDTEXIMAGEPROC)(*load)("glGetCompressedTexImage");
  }
  if (GLAD_GL_VERSION_1_4 != 0) {
    glad_glBlendFuncSeparate = (PFNGLBLENDFUNCSEPARATEPROC)(*load)("glBlendFuncSeparate");
    glad_glMultiDrawArrays = (PFNGLMULTIDRAWARRAYSPROC)(*load)("glMultiDrawArrays");
    glad_glMultiDrawElements = (PFNGLMULTIDRAWELEMENTSPROC)(*load)("glMultiDrawElements");
    glad_glPointParameterf = (PFNGLPOINTPARAMETERFPROC)(*load)("glPointParameterf");
    glad_glPointParameterfv = (PFNGLPOINTPARAMETERFVPROC)(*load)("glPointParameterfv");
    glad_glPointParameteri = (PFNGLPOINTPARAMETERIPROC)(*load)("glPointParameteri");
    glad_glPointParameteriv = (PFNGLPOINTPARAMETERIVPROC)(*load)("glPointParameteriv");
    glad_glBlendColor = (PFNGLBLENDCOLORPROC)(*load)("glBlendColor");
    glad_glBlendEquation = (PFNGLBLENDEQUATIONPROC)(*load)("glBlendEquation");
  }
  if (GLAD_GL_VERSION_1_5 != 0) {
    glad_glGenQueries = (PFNGLGENQUERIESPROC)(*load)("glGenQueries");
    glad_glDeleteQueries = (PFNGLDELETEQUERIESPROC)(*load)("glDeleteQueries");
    glad_glIsQuery = (PFNGLISQUERYPROC)(*load)("glIsQuery");
    glad_glBeginQuery = (PFNGLBEGINQUERYPROC)(*load)("glBeginQuery");
    glad_glEndQuery = (PFNGLENDQUERYPROC)(*load)("glEndQuery");
    glad_glGetQueryiv = (PFNGLGETQUERYIVPROC)(*load)("glGetQueryiv");
    glad_glGetQueryObjectiv = (PFNGLGETQUERYOBJECTIVPROC)(*load)("glGetQueryObjectiv");
    glad_glGetQueryObjectuiv = (PFNGLGETQUERYOBJECTUIVPROC)(*load)("glGetQueryObjectuiv");
    glad_glBindBuffer = (PFNGLBINDBUFFERPROC)(*load)("glBindBuffer");
    glad_glDeleteBuffers = (PFNGLDELETEBUFFERSPROC)(*load)("glDeleteBuffers");
    glad_glGenBuffers = (PFNGLGENBUFFERSPROC)(*load)("glGenBuffers");
    glad_glIsBuffer = (PFNGLISBUFFERPROC)(*load)("glIsBuffer");
    glad_glBufferData = (PFNGLBUFFERDATAPROC)(*load)("glBufferData");
    glad_glBufferSubData = (PFNGLBUFFERSUBDATAPROC)(*load)("glBufferSubData");
    glad_glGetBufferSubData = (PFNGLGETBUFFERSUBDATAPROC)(*load)("glGetBufferSubData");
    glad_glMapBuffer = (PFNGLMAPBUFFERPROC)(*load)("glMapBuffer");
    glad_glUnmapBuffer = (PFNGLUNMAPBUFFERPROC)(*load)("glUnmapBuffer");
    glad_glGetBufferParameteriv = (PFNGLGETBUFFERPARAMETERIVPROC)(*load)("glGetBufferParameteriv");
    glad_glGetBufferPointerv = (PFNGLGETBUFFERPOINTERVPROC)(*load)("glGetBufferPointerv");
  }
  if (GLAD_GL_VERSION_2_0 != 0) {
    glad_glBlendEquationSeparate =
         (PFNGLBLENDEQUATIONSEPARATEPROC)(*load)("glBlendEquationSeparate");
    glad_glDrawBuffers = (PFNGLDRAWBUFFERSPROC)(*load)("glDrawBuffers");
    glad_glStencilOpSeparate = (PFNGLSTENCILOPSEPARATEPROC)(*load)("glStencilOpSeparate");
    glad_glStencilFuncSeparate = (PFNGLSTENCILFUNCSEPARATEPROC)(*load)("glStencilFuncSeparate");
    glad_glStencilMaskSeparate = (PFNGLSTENCILMASKSEPARATEPROC)(*load)("glStencilMaskSeparate");
    glad_glAttachShader = (PFNGLATTACHSHADERPROC)(*load)("glAttachShader");
    glad_glBindAttribLocation = (PFNGLBINDATTRIBLOCATIONPROC)(*load)("glBindAttribLocation");
    glad_glCompileShader = (PFNGLCOMPILESHADERPROC)(*load)("glCompileShader");
    glad_glCreateProgram = (PFNGLCREATEPROGRAMPROC)(*load)("glCreateProgram");
    glad_glCreateShader = (PFNGLCREATESHADERPROC)(*load)("glCreateShader");
    glad_glDeleteProgram = (PFNGLDELETEPROGRAMPROC)(*load)("glDeleteProgram");
    glad_glDeleteShader = (PFNGLDELETESHADERPROC)(*load)("glDeleteShader");
    glad_glDetachShader = (PFNGLDETACHSHADERPROC)(*load)("glDetachShader");
    glad_glDisableVertexAttribArray =
         (PFNGLDISABLEVERTEXATTRIBARRAYPROC)(*load)("glDisableVertexAttribArray");
    glad_glEnableVertexAttribArray =
         (PFNGLENABLEVERTEXATTRIBARRAYPROC)(*load)("glEnableVertexAttribArray");
    glad_glGetActiveAttrib = (PFNGLGETACTIVEATTRIBPROC)(*load)("glGetActiveAttrib");
    glad_glGetActiveUniform = (PFNGLGETACTIVEUNIFORMPROC)(*load)("glGetActiveUniform");
    glad_glGetAttachedShaders = (PFNGLGETATTACHEDSHADERSPROC)(*load)("glGetAttachedShaders");
    glad_glGetAttribLocation = (PFNGLGETATTRIBLOCATIONPROC)(*load)("glGetAttribLocation");
    glad_glGetProgramiv = (PFNGLGETPROGRAMIVPROC)(*load)("glGetProgramiv");
    glad_glGetProgramInfoLog = (PFNGLGETPROGRAMINFOLOGPROC)(*load)("glGetProgramInfoLog");
    glad_glGetShaderiv = (PFNGLGETSHADERIVPROC)(*load)("glGetShaderiv");
    glad_glGetShaderInfoLog = (PFNGLGETSHADERINFOLOGPROC)(*load)("glGetShaderInfoLog");
    glad_glGetShaderSource = (PFNGLGETSHADERSOURCEPROC)(*load)("glGetShaderSource");
    glad_glGetUniformLocation = (PFNGLGETUNIFORMLOCATIONPROC)(*load)("glGetUniformLocation");
    glad_glGetUniformfv = (PFNGLGETUNIFORMFVPROC)(*load)("glGetUniformfv");
    glad_glGetUniformiv = (PFNGLGETUNIFORMIVPROC)(*load)("glGetUniformiv");
    glad_glGetVertexAttribdv = (PFNGLGETVERTEXATTRIBDVPROC)(*load)("glGetVertexAttribdv");
    glad_glGetVertexAttribfv = (PFNGLGETVERTEXATTRIBFVPROC)(*load)("glGetVertexAttribfv");
    glad_glGetVertexAttribiv = (PFNGLGETVERTEXATTRIBIVPROC)(*load)("glGetVertexAttribiv");
    glad_glGetVertexAttribPointerv =
         (PFNGLGETVERTEXATTRIBPOINTERVPROC)(*load)("glGetVertexAttribPointerv");
    glad_glIsProgram = (PFNGLISPROGRAMPROC)(*load)("glIsProgram");
    glad_glIsShader = (PFNGLISSHADERPROC)(*load)("glIsShader");
    glad_glLinkProgram = (PFNGLLINKPROGRAMPROC)(*load)("glLinkProgram");
    glad_glShaderSource = (PFNGLSHADERSOURCEPROC)(*load)("glShaderSource");
    glad_glUseProgram = (PFNGLUSEPROGRAMPROC)(*load)("glUseProgram");
    glad_glUniform1f = (PFNGLUNIFORM1FPROC)(*load)("glUniform1f");
    glad_glUniform2f = (PFNGLUNIFORM2FPROC)(*load)("glUniform2f");
    glad_glUniform3f = (PFNGLUNIFORM3FPROC)(*load)("glUniform3f");
    glad_glUniform4f = (PFNGLUNIFORM4FPROC)(*load)("glUniform4f");
    glad_glUniform1i = (PFNGLUNIFORM1IPROC)(*load)("glUniform1i");
    glad_glUniform2i = (PFNGLUNIFORM2IPROC)(*load)("glUniform2i");
    glad_glUniform3i = (PFNGLUNIFORM3IPROC)(*load)("glUniform3i");
    glad_glUniform4i = (PFNGLUNIFORM4IPROC)(*load)("glUniform4i");
    glad_glUniform1fv = (PFNGLUNIFORM1FVPROC)(*load)("glUniform1fv");
    glad_glUniform2fv = (PFNGLUNIFORM2FVPROC)(*load)("glUniform2fv");
    glad_glUniform3fv = (PFNGLUNIFORM3FVPROC)(*load)("glUniform3fv");
    glad_glUniform4fv = (PFNGLUNIFORM4FVPROC)(*load)("glUniform4fv");
    glad_glUniform1iv = (PFNGLUNIFORM1IVPROC)(*load)("glUniform1iv");
    glad_glUniform2iv = (PFNGLUNIFORM2IVPROC)(*load)("glUniform2iv");
    glad_glUniform3iv = (PFNGLUNIFORM3IVPROC)(*load)("glUniform3iv");
    glad_glUniform4iv = (PFNGLUNIFORM4IVPROC)(*load)("glUniform4iv");
    glad_glUniformMatrix2fv = (PFNGLUNIFORMMATRIX2FVPROC)(*load)("glUniformMatrix2fv");
    glad_glUniformMatrix3fv = (PFNGLUNIFORMMATRIX3FVPROC)(*load)("glUniformMatrix3fv");
    glad_glUniformMatrix4fv = (PFNGLUNIFORMMATRIX4FVPROC)(*load)("glUniformMatrix4fv");
    glad_glValidateProgram = (PFNGLVALIDATEPROGRAMPROC)(*load)("glValidateProgram");
    glad_glVertexAttrib1d = (PFNGLVERTEXATTRIB1DPROC)(*load)("glVertexAttrib1d");
    glad_glVertexAttrib1dv = (PFNGLVERTEXATTRIB1DVPROC)(*load)("glVertexAttrib1dv");
    glad_glVertexAttrib1f = (PFNGLVERTEXATTRIB1FPROC)(*load)("glVertexAttrib1f");
    glad_glVertexAttrib1fv = (PFNGLVERTEXATTRIB1FVPROC)(*load)("glVertexAttrib1fv");
    glad_glVertexAttrib1s = (PFNGLVERTEXATTRIB1SPROC)(*load)("glVertexAttrib1s");
    glad_glVertexAttrib1sv = (PFNGLVERTEXATTRIB1SVPROC)(*load)("glVertexAttrib1sv");
    glad_glVertexAttrib2d = (PFNGLVERTEXATTRIB2DPROC)(*load)("glVertexAttrib2d");
    glad_glVertexAttrib2dv = (PFNGLVERTEXATTRIB2DVPROC)(*load)("glVertexAttrib2dv");
    glad_glVertexAttrib2f = (PFNGLVERTEXATTRIB2FPROC)(*load)("glVertexAttrib2f");
    glad_glVertexAttrib2fv = (PFNGLVERTEXATTRIB2FVPROC)(*load)("glVertexAttrib2fv");
    glad_glVertexAttrib2s = (PFNGLVERTEXATTRIB2SPROC)(*load)("glVertexAttrib2s");
    glad_glVertexAttrib2sv = (PFNGLVERTEXATTRIB2SVPROC)(*load)("glVertexAttrib2sv");
    glad_glVertexAttrib3d = (PFNGLVERTEXATTRIB3DPROC)(*load)("glVertexAttrib3d");
    glad_glVertexAttrib3dv = (PFNGLVERTEXATTRIB3DVPROC)(*load)("glVertexAttrib3dv");
    glad_glVertexAttrib3f = (PFNGLVERTEXATTRIB3FPROC)(*load)("glVertexAttrib3f");
    glad_glVertexAttrib3fv = (PFNGLVERTEXATTRIB3FVPROC)(*load)("glVertexAttrib3fv");
    glad_glVertexAttrib3s = (PFNGLVERTEXATTRIB3SPROC)(*load)("glVertexAttrib3s");
    glad_glVertexAttrib3sv = (PFNGLVERTEXATTRIB3SVPROC)(*load)("glVertexAttrib3sv");
    glad_glVertexAttrib4Nbv = (PFNGLVERTEXATTRIB4NBVPROC)(*load)("glVertexAttrib4Nbv");
    glad_glVertexAttrib4Niv = (PFNGLVERTEXATTRIB4NIVPROC)(*load)("glVertexAttrib4Niv");
    glad_glVertexAttrib4Nsv = (PFNGLVERTEXATTRIB4NSVPROC)(*load)("glVertexAttrib4Nsv");
    glad_glVertexAttrib4Nub = (PFNGLVERTEXATTRIB4NUBPROC)(*load)("glVertexAttrib4Nub");
    glad_glVertexAttrib4Nubv = (PFNGLVERTEXATTRIB4NUBVPROC)(*load)("glVertexAttrib4Nubv");
    glad_glVertexAttrib4Nuiv = (PFNGLVERTEXATTRIB4NUIVPROC)(*load)("glVertexAttrib4Nuiv");
    glad_glVertexAttrib4Nusv = (PFNGLVERTEXATTRIB4NUSVPROC)(*load)("glVertexAttrib4Nusv");
    glad_glVertexAttrib4bv = (PFNGLVERTEXATTRIB4BVPROC)(*load)("glVertexAttrib4bv");
    glad_glVertexAttrib4d = (PFNGLVERTEXATTRIB4DPROC)(*load)("glVertexAttrib4d");
    glad_glVertexAttrib4dv = (PFNGLVERTEXATTRIB4DVPROC)(*load)("glVertexAttrib4dv");
    glad_glVertexAttrib4f = (PFNGLVERTEXATTRIB4FPROC)(*load)("glVertexAttrib4f");
    glad_glVertexAttrib4fv = (PFNGLVERTEXATTRIB4FVPROC)(*load)("glVertexAttrib4fv");
    glad_glVertexAttrib4iv = (PFNGLVERTEXATTRIB4IVPROC)(*load)("glVertexAttrib4iv");
    glad_glVertexAttrib4s = (PFNGLVERTEXATTRIB4SPROC)(*load)("glVertexAttrib4s");
    glad_glVertexAttrib4sv = (PFNGLVERTEXATTRIB4SVPROC)(*load)("glVertexAttrib4sv");
    glad_glVertexAttrib4ubv = (PFNGLVERTEXATTRIB4UBVPROC)(*load)("glVertexAttrib4ubv");
    glad_glVertexAttrib4uiv = (PFNGLVERTEXATTRIB4UIVPROC)(*load)("glVertexAttrib4uiv");
    glad_glVertexAttrib4usv = (PFNGLVERTEXATTRIB4USVPROC)(*load)("glVertexAttrib4usv");
    glad_glVertexAttribPointer = (PFNGLVERTEXATTRIBPOINTERPROC)(*load)("glVertexAttribPointer");
  }
  if (GLAD_GL_VERSION_2_1 != 0) {
    glad_glUniformMatrix2x3fv = (PFNGLUNIFORMMATRIX2X3FVPROC)(*load)("glUniformMatrix2x3fv");
    glad_glUniformMatrix3x2fv = (PFNGLUNIFORMMATRIX3X2FVPROC)(*load)("glUniformMatrix3x2fv");
    glad_glUniformMatrix2x4fv = (PFNGLUNIFORMMATRIX2X4FVPROC)(*load)("glUniformMatrix2x4fv");
    glad_glUniformMatrix4x2fv = (PFNGLUNIFORMMATRIX4X2FVPROC)(*load)("glUniformMatrix4x2fv");
    glad_glUniformMatrix3x4fv = (PFNGLUNIFORMMATRIX3X4FVPROC)(*load)("glUniformMatrix3x4fv");
    glad_glUniformMatrix4x3fv = (PFNGLUNIFORMMATRIX4X3FVPROC)(*load)("glUniformMatrix4x3fv");
  }
  if (GLAD_GL_VERSION_3_0 != 0) {
    glad_glColorMaski = (PFNGLCOLORMASKIPROC)(*load)("glColorMaski");
    glad_glGetBooleani_v = (PFNGLGETBOOLEANI_VPROC)(*load)("glGetBooleani_v");
    glad_glGetIntegeri_v = (PFNGLGETINTEGERI_VPROC)(*load)("glGetIntegeri_v");
    glad_glEnablei = (PFNGLENABLEIPROC)(*load)("glEnablei");
    glad_glDisablei = (PFNGLDISABLEIPROC)(*load)("glDisablei");
    glad_glIsEnabledi = (PFNGLISENABLEDIPROC)(*load)("glIsEnabledi");
    glad_glBeginTransformFeedback =
         (PFNGLBEGINTRANSFORMFEEDBACKPROC)(*load)("glBeginTransformFeedback");
    glad_glEndTransformFeedback = (PFNGLENDTRANSFORMFEEDBACKPROC)(*load)("glEndTransformFeedback");
    glad_glBindBufferRange = (PFNGLBINDBUFFERRANGEPROC)(*load)("glBindBufferRange");
    glad_glBindBufferBase = (PFNGLBINDBUFFERBASEPROC)(*load)("glBindBufferBase");
    glad_glTransformFeedbackVaryings =
         (PFNGLTRANSFORMFEEDBACKVARYINGSPROC)(*load)("glTransformFeedbackVaryings");
    glad_glGetTransformFeedbackVarying =
         (PFNGLGETTRANSFORMFEEDBACKVARYINGPROC)(*load)("glGetTransformFeedbackVarying");
    glad_glClampColor = (PFNGLCLAMPCOLORPROC)(*load)("glClampColor");
    glad_glBeginConditionalRender =
         (PFNGLBEGINCONDITIONALRENDERPROC)(*load)("glBeginConditionalRender");
    glad_glEndConditionalRender = (PFNGLENDCONDITIONALRENDERPROC)(*load)("glEndConditionalRender");
    glad_glVertexAttribIPointer = (PFNGLVERTEXATTRIBIPOINTERPROC)(*load)("glVertexAttribIPointer");
    glad_glGetVertexAttribIiv = (PFNGLGETVERTEXATTRIBIIVPROC)(*load)("glGetVertexAttribIiv");
    glad_glGetVertexAttribIuiv = (PFNGLGETVERTEXATTRIBIUIVPROC)(*load)("glGetVertexAttribIuiv");
    glad_glVertexAttribI1i = (PFNGLVERTEXATTRIBI1IPROC)(*load)("glVertexAttribI1i");
    glad_glVertexAttribI2i = (PFNGLVERTEXATTRIBI2IPROC)(*load)("glVertexAttribI2i");
    glad_glVertexAttribI3i = (PFNGLVERTEXATTRIBI3IPROC)(*load)("glVertexAttribI3i");
    glad_glVertexAttribI4i = (PFNGLVERTEXATTRIBI4IPROC)(*load)("glVertexAttribI4i");
    glad_glVertexAttribI1ui = (PFNGLVERTEXATTRIBI1UIPROC)(*load)("glVertexAttribI1ui");
    glad_glVertexAttribI2ui = (PFNGLVERTEXATTRIBI2UIPROC)(*load)("glVertexAttribI2ui");
    glad_glVertexAttribI3ui = (PFNGLVERTEXATTRIBI3UIPROC)(*load)("glVertexAttribI3ui");
    glad_glVertexAttribI4ui = (PFNGLVERTEXATTRIBI4UIPROC)(*load)("glVertexAttribI4ui");
    glad_glVertexAttribI1iv = (PFNGLVERTEXATTRIBI1IVPROC)(*load)("glVertexAttribI1iv");
    glad_glVertexAttribI2iv = (PFNGLVERTEXATTRIBI2IVPROC)(*load)("glVertexAttribI2iv");
    glad_glVertexAttribI3iv = (PFNGLVERTEXATTRIBI3IVPROC)(*load)("glVertexAttribI3iv");
    glad_glVertexAttribI4iv = (PFNGLVERTEXATTRIBI4IVPROC)(*load)("glVertexAttribI4iv");
    glad_glVertexAttribI1uiv = (PFNGLVERTEXATTRIBI1UIVPROC)(*load)("glVertexAttribI1uiv");
    glad_glVertexAttribI2uiv = (PFNGLVERTEXATTRIBI2UIVPROC)(*load)("glVertexAttribI2uiv");
    glad_glVertexAttribI3uiv = (PFNGLVERTEXATTRIBI3UIVPROC)(*load)("glVertexAttribI3uiv");
    glad_glVertexAttribI4uiv = (PFNGLVERTEXATTRIBI4UIVPROC)(*load)("glVertexAttribI4uiv");
    glad_glVertexAttribI4bv = (PFNGLVERTEXATTRIBI4BVPROC)(*load)("glVertexAttribI4bv");
    glad_glVertexAttribI4sv = (PFNGLVERTEXATTRIBI4SVPROC)(*load)("glVertexAttribI4sv");
    glad_glVertexAttribI4ubv = (PFNGLVERTEXATTRIBI4UBVPROC)(*load)("glVertexAttribI4ubv");
    glad_glVertexAttribI4usv = (PFNGLVERTEXATTRIBI4USVPROC)(*load)("glVertexAttribI4usv");
    glad_glGetUniformuiv = (PFNGLGETUNIFORMUIVPROC)(*load)("glGetUniformuiv");
    glad_glBindFragDataLocation = (PFNGLBINDFRAGDATALOCATIONPROC)(*load)("glBindFragDataLocation");
    glad_glGetFragDataLocation = (PFNGLGETFRAGDATALOCATIONPROC)(*load)("glGetFragDataLocation");
    glad_glUniform1ui = (PFNGLUNIFORM1UIPROC)(*load)("glUniform1ui");
    glad_glUniform2ui = (PFNGLUNIFORM2UIPROC)(*load)("glUniform2ui");
    glad_glUniform3ui = (PFNGLUNIFORM3UIPROC)(*load)("glUniform3ui");
    glad_glUniform4ui = (PFNGLUNIFORM4UIPROC)(*load)("glUniform4ui");
    glad_glUniform1uiv = (PFNGLUNIFORM1UIVPROC)(*load)("glUniform1uiv");
    glad_glUniform2uiv = (PFNGLUNIFORM2UIVPROC)(*load)("glUniform2uiv");
    glad_glUniform3uiv = (PFNGLUNIFORM3UIVPROC)(*load)("glUniform3uiv");
    glad_glUniform4uiv = (PFNGLUNIFORM4UIVPROC)(*load)("glUniform4uiv");
    glad_glTexParameterIiv = (PFNGLTEXPARAMETERIIVPROC)(*load)("glTexParameterIiv");
    glad_glTexParameterIuiv = (PFNGLTEXPARAMETERIUIVPROC)(*load)("glTexParameterIuiv");
    glad_glGetTexParameterIiv = (PFNGLGETTEXPARAMETERIIVPROC)(*load)("glGetTexParameterIiv");
    glad_glGetTexParameterIuiv = (PFNGLGETTEXPARAMETERIUIVPROC)(*load)("glGetTexParameterIuiv");
    glad_glClearBufferiv = (PFNGLCLEARBUFFERIVPROC)(*load)("glClearBufferiv");
    glad_glClearBufferuiv = (PFNGLCLEARBUFFERUIVPROC)(*load)("glClearBufferuiv");
    glad_glClearBufferfv = (PFNGLCLEARBUFFERFVPROC)(*load)("glClearBufferfv");
    glad_glClearBufferfi = (PFNGLCLEARBUFFERFIPROC)(*load)("glClearBufferfi");
    glad_glGetStringi = (PFNGLGETSTRINGIPROC)(*load)("glGetStringi");
    glad_glIsRenderbuffer = (PFNGLISRENDERBUFFERPROC)(*load)("glIsRenderbuffer");
    glad_glBindRenderbuffer = (PFNGLBINDRENDERBUFFERPROC)(*load)("glBindRenderbuffer");
    glad_glDeleteRenderbuffers = (PFNGLDELETERENDERBUFFERSPROC)(*load)("glDeleteRenderbuffers");
    glad_glGenRenderbuffers = (PFNGLGENRENDERBUFFERSPROC)(*load)("glGenRenderbuffers");
    glad_glRenderbufferStorage = (PFNGLRENDERBUFFERSTORAGEPROC)(*load)("glRenderbufferStorage");
    glad_glGetRenderbufferParameteriv =
         (PFNGLGETRENDERBUFFERPARAMETERIVPROC)(*load)("glGetRenderbufferParameteriv");
    glad_glIsFramebuffer = (PFNGLISFRAMEBUFFERPROC)(*load)("glIsFramebuffer");
    glad_glBindFramebuffer = (PFNGLBINDFRAMEBUFFERPROC)(*load)("glBindFramebuffer");
    glad_glDeleteFramebuffers = (PFNGLDELETEFRAMEBUFFERSPROC)(*load)("glDeleteFramebuffers");
    glad_glGenFramebuffers = (PFNGLGENFRAMEBUFFERSPROC)(*load)("glGenFramebuffers");
    glad_glCheckFramebufferStatus =
         (PFNGLCHECKFRAMEBUFFERSTATUSPROC)(*load)("glCheckFramebufferStatus");
    glad_glFramebufferTexture1D = (PFNGLFRAMEBUFFERTEXTURE1DPROC)(*load)("glFramebufferTexture1D");
    glad_glFramebufferTexture2D = (PFNGLFRAMEBUFFERTEXTURE2DPROC)(*load)("glFramebufferTexture2D");
    glad_glFramebufferTexture3D = (PFNGLFRAMEBUFFERTEXTURE3DPROC)(*load)("glFramebufferTexture3D");
    glad_glFramebufferRenderbuffer =
         (PFNGLFRAMEBUFFERRENDERBUFFERPROC)(*load)("glFramebufferRenderbuffer");
    glad_glGetFramebufferAttachmentParameteriv =
         (PFNGLGETFRAMEBUFFERATTACHMENTPARAMETERIVPROC)
         (*load)("glGetFramebufferAttachmentParameteriv");
    glad_glGenerateMipmap = (PFNGLGENERATEMIPMAPPROC)(*load)("glGenerateMipmap");
    glad_glBlitFramebuffer = (PFNGLBLITFRAMEBUFFERPROC)(*load)("glBlitFramebuffer");
    glad_glRenderbufferStorageMultisample =
         (PFNGLRENDERBUFFERSTORAGEMULTISAMPLEPROC)(*load)("glRenderbufferStorageMultisample");
    glad_glFramebufferTextureLayer =
         (PFNGLFRAMEBUFFERTEXTURELAYERPROC)(*load)("glFramebufferTextureLayer");
    glad_glMapBufferRange = (PFNGLMAPBUFFERRANGEPROC)(*load)("glMapBufferRange");
    glad_glFlushMappedBufferRange =
         (PFNGLFLUSHMAPPEDBUFFERRANGEPROC)(*load)("glFlushMappedBufferRange");
    glad_glBindVertexArray = (PFNGLBINDVERTEXARRAYPROC)(*load)("glBindVertexArray");
    glad_glDeleteVertexArrays = (PFNGLDELETEVERTEXARRAYSPROC)(*load)("glDeleteVertexArrays");
    glad_glGenVertexArrays = (PFNGLGENVERTEXARRAYSPROC)(*load)("glGenVertexArrays");
    glad_glIsVertexArray = (PFNGLISVERTEXARRAYPROC)(*load)("glIsVertexArray");
  }
  if (GLAD_GL_VERSION_3_1 != 0) {
    glad_glDrawArraysInstanced = (PFNGLDRAWARRAYSINSTANCEDPROC)(*load)("glDrawArraysInstanced");
    glad_glDrawElementsInstanced =
         (PFNGLDRAWELEMENTSINSTANCEDPROC)(*load)("glDrawElementsInstanced");
    glad_glTexBuffer = (PFNGLTEXBUFFERPROC)(*load)("glTexBuffer");
    glad_glPrimitiveRestartIndex =
         (PFNGLPRIMITIVERESTARTINDEXPROC)(*load)("glPrimitiveRestartIndex");
    glad_glCopyBufferSubData = (PFNGLCOPYBUFFERSUBDATAPROC)(*load)("glCopyBufferSubData");
    glad_glGetUniformIndices = (PFNGLGETUNIFORMINDICESPROC)(*load)("glGetUniformIndices");
    glad_glGetActiveUniformsiv = (PFNGLGETACTIVEUNIFORMSIVPROC)(*load)("glGetActiveUniformsiv");
    glad_glGetActiveUniformName = (PFNGLGETACTIVEUNIFORMNAMEPROC)(*load)("glGetActiveUniformName");
    glad_glGetUniformBlockIndex = (PFNGLGETUNIFORMBLOCKINDEXPROC)(*load)("glGetUniformBlockIndex");
    glad_glGetActiveUniformBlockiv =
         (PFNGLGETACTIVEUNIFORMBLOCKIVPROC)(*load)("glGetActiveUniformBlockiv");
    glad_glGetActiveUniformBlockName =
         (PFNGLGETACTIVEUNIFORMBLOCKNAMEPROC)(*load)("glGetActiveUniformBlockName");
    glad_glUniformBlockBinding = (PFNGLUNIFORMBLOCKBINDINGPROC)(*load)("glUniformBlockBinding");
    glad_glBindBufferRange = (PFNGLBINDBUFFERRANGEPROC)(*load)("glBindBufferRange");
    glad_glBindBufferBase = (PFNGLBINDBUFFERBASEPROC)(*load)("glBindBufferBase");
    glad_glGetIntegeri_v = (PFNGLGETINTEGERI_VPROC)(*load)("glGetIntegeri_v");
  }
  if (GLAD_GL_VERSION_3_2 != 0) {
    glad_glDrawElementsBaseVertex =
         (PFNGLDRAWELEMENTSBASEVERTEXPROC)(*load)("glDrawElementsBaseVertex");
    glad_glDrawRangeElementsBaseVertex =
         (PFNGLDRAWRANGEELEMENTSBASEVERTEXPROC)(*load)("glDrawRangeElementsBaseVertex");
    glad_glDrawElementsInstancedBaseVertex =
         (PFNGLDRAWELEMENTSINSTANCEDBASEVERTEXPROC)(*load)("glDrawElementsInstancedBaseVertex");
    glad_glMultiDrawElementsBaseVertex =
         (PFNGLMULTIDRAWELEMENTSBASEVERTEXPROC)(*load)("glMultiDrawElementsBaseVertex");
    glad_glProvokingVertex = (PFNGLPROVOKINGVERTEXPROC)(*load)("glProvokingVertex");
    glad_glFenceSync = (PFNGLFENCESYNCPROC)(*load)("glFenceSync");
    glad_glIsSync = (PFNGLISSYNCPROC)(*load)("glIsSync");
    glad_glDeleteSync = (PFNGLDELETESYNCPROC)(*load)("glDeleteSync");
    glad_glClientWaitSync = (PFNGLCLIENTWAITSYNCPROC)(*load)("glClientWaitSync");
    glad_glWaitSync = (PFNGLWAITSYNCPROC)(*load)("glWaitSync");
    glad_glGetInteger64v = (PFNGLGETINTEGER64VPROC)(*load)("glGetInteger64v");
    glad_glGetSynciv = (PFNGLGETSYNCIVPROC)(*load)("glGetSynciv");
    glad_glGetInteger64i_v = (PFNGLGETINTEGER64I_VPROC)(*load)("glGetInteger64i_v");
    glad_glGetBufferParameteri64v =
         (PFNGLGETBUFFERPARAMETERI64VPROC)(*load)("glGetBufferParameteri64v");
    glad_glFramebufferTexture = (PFNGLFRAMEBUFFERTEXTUREPROC)(*load)("glFramebufferTexture");
    glad_glTexImage2DMultisample =
         (PFNGLTEXIMAGE2DMULTISAMPLEPROC)(*load)("glTexImage2DMultisample");
    glad_glTexImage3DMultisample =
         (PFNGLTEXIMAGE3DMULTISAMPLEPROC)(*load)("glTexImage3DMultisample");
    glad_glGetMultisamplefv = (PFNGLGETMULTISAMPLEFVPROC)(*load)("glGetMultisamplefv");
    glad_glSampleMaski = (PFNGLSAMPLEMASKIPROC)(*load)("glSampleMaski");
  }
  if (GLAD_GL_VERSION_3_3 != 0) {
    glad_glBindFragDataLocationIndexed =
         (PFNGLBINDFRAGDATALOCATIONINDEXEDPROC)(*load)("glBindFragDataLocationIndexed");
    glad_glGetFragDataIndex = (PFNGLGETFRAGDATAINDEXPROC)(*load)("glGetFragDataIndex");
    glad_glGenSamplers = (PFNGLGENSAMPLERSPROC)(*load)("glGenSamplers");
    glad_glDeleteSamplers = (PFNGLDELETESAMPLERSPROC)(*load)("glDeleteSamplers");
    glad_glIsSampler = (PFNGLISSAMPLERPROC)(*load)("glIsSampler");
    glad_glBindSampler = (PFNGLBINDSAMPLERPROC)(*load)("glBindSampler");
    glad_glSamplerParameteri = (PFNGLSAMPLERPARAMETERIPROC)(*load)("glSamplerParameteri");
    glad_glSamplerParameteriv = (PFNGLSAMPLERPARAMETERIVPROC)(*load)("glSamplerParameteriv");
    glad_glSamplerParameterf = (PFNGLSAMPLERPARAMETERFPROC)(*load)("glSamplerParameterf");
    glad_glSamplerParameterfv = (PFNGLSAMPLERPARAMETERFVPROC)(*load)("glSamplerParameterfv");
    glad_glSamplerParameterIiv = (PFNGLSAMPLERPARAMETERIIVPROC)(*load)("glSamplerParameterIiv");
    glad_glSamplerParameterIuiv = (PFNGLSAMPLERPARAMETERIUIVPROC)(*load)("glSamplerParameterIuiv");
    glad_glGetSamplerParameteriv =
         (PFNGLGETSAMPLERPARAMETERIVPROC)(*load)("glGetSamplerParameteriv");
    glad_glGetSamplerParameterIiv =
         (PFNGLGETSAMPLERPARAMETERIIVPROC)(*load)("glGetSamplerParameterIiv");
    glad_glGetSamplerParameterfv =
         (PFNGLGETSAMPLERPARAMETERFVPROC)(*load)("glGetSamplerParameterfv");
    glad_glGetSamplerParameterIuiv =
         (PFNGLGETSAMPLERPARAMETERIUIVPROC)(*load)("glGetSamplerParameterIuiv");
    glad_glQueryCounter = (PFNGLQUERYCOUNTERPROC)(*load)("glQueryCounter");
    glad_glGetQueryObjecti64v = (PFNGLGETQUERYOBJECTI64VPROC)(*load)("glGetQueryObjecti64v");
    glad_glGetQueryObjectui64v = (PFNGLGETQUERYOBJECTUI64VPROC)(*load)("glGetQueryObjectui64v");
    glad_glVertexAttribDivisor = (PFNGLVERTEXATTRIBDIVISORPROC)(*load)("glVertexAttribDivisor");
    glad_glVertexAttribP1ui = (PFNGLVERTEXATTRIBP1UIPROC)(*load)("glVertexAttribP1ui");
    glad_glVertexAttribP1uiv = (PFNGLVERTEXATTRIBP1UIVPROC)(*load)("glVertexAttribP1uiv");
    glad_glVertexAttribP2ui = (PFNGLVERTEXATTRIBP2UIPROC)(*load)("glVertexAttribP2ui");
    glad_glVertexAttribP2uiv = (PFNGLVERTEXATTRIBP2UIVPROC)(*load)("glVertexAttribP2uiv");
    glad_glVertexAttribP3ui = (PFNGLVERTEXATTRIBP3UIPROC)(*load)("glVertexAttribP3ui");
    glad_glVertexAttribP3uiv = (PFNGLVERTEXATTRIBP3UIVPROC)(*load)("glVertexAttribP3uiv");
    glad_glVertexAttribP4ui = (PFNGLVERTEXATTRIBP4UIPROC)(*load)("glVertexAttribP4ui");
    glad_glVertexAttribP4uiv = (PFNGLVERTEXATTRIBP4UIVPROC)(*load)("glVertexAttribP4uiv");
    glad_glVertexP2ui = (PFNGLVERTEXP2UIPROC)(*load)("glVertexP2ui");
    glad_glVertexP2uiv = (PFNGLVERTEXP2UIVPROC)(*load)("glVertexP2uiv");
    glad_glVertexP3ui = (PFNGLVERTEXP3UIPROC)(*load)("glVertexP3ui");
    glad_glVertexP3uiv = (PFNGLVERTEXP3UIVPROC)(*load)("glVertexP3uiv");
    glad_glVertexP4ui = (PFNGLVERTEXP4UIPROC)(*load)("glVertexP4ui");
    glad_glVertexP4uiv = (PFNGLVERTEXP4UIVPROC)(*load)("glVertexP4uiv");
    glad_glTexCoordP1ui = (PFNGLTEXCOORDP1UIPROC)(*load)("glTexCoordP1ui");
    glad_glTexCoordP1uiv = (PFNGLTEXCOORDP1UIVPROC)(*load)("glTexCoordP1uiv");
    glad_glTexCoordP2ui = (PFNGLTEXCOORDP2UIPROC)(*load)("glTexCoordP2ui");
    glad_glTexCoordP2uiv = (PFNGLTEXCOORDP2UIVPROC)(*load)("glTexCoordP2uiv");
    glad_glTexCoordP3ui = (PFNGLTEXCOORDP3UIPROC)(*load)("glTexCoordP3ui");
    glad_glTexCoordP3uiv = (PFNGLTEXCOORDP3UIVPROC)(*load)("glTexCoordP3uiv");
    glad_glTexCoordP4ui = (PFNGLTEXCOORDP4UIPROC)(*load)("glTexCoordP4ui");
    glad_glTexCoordP4uiv = (PFNGLTEXCOORDP4UIVPROC)(*load)("glTexCoordP4uiv");
    glad_glMultiTexCoordP1ui = (PFNGLMULTITEXCOORDP1UIPROC)(*load)("glMultiTexCoordP1ui");
    glad_glMultiTexCoordP1uiv = (PFNGLMULTITEXCOORDP1UIVPROC)(*load)("glMultiTexCoordP1uiv");
    glad_glMultiTexCoordP2ui = (PFNGLMULTITEXCOORDP2UIPROC)(*load)("glMultiTexCoordP2ui");
    glad_glMultiTexCoordP2uiv = (PFNGLMULTITEXCOORDP2UIVPROC)(*load)("glMultiTexCoordP2uiv");
    glad_glMultiTexCoordP3ui = (PFNGLMULTITEXCOORDP3UIPROC)(*load)("glMultiTexCoordP3ui");
    glad_glMultiTexCoordP3uiv = (PFNGLMULTITEXCOORDP3UIVPROC)(*load)("glMultiTexCoordP3uiv");
    glad_glMultiTexCoordP4ui = (PFNGLMULTITEXCOORDP4UIPROC)(*load)("glMultiTexCoordP4ui");
    glad_glMultiTexCoordP4uiv = (PFNGLMULTITEXCOORDP4UIVPROC)(*load)("glMultiTexCoordP4uiv");
    glad_glNormalP3ui = (PFNGLNORMALP3UIPROC)(*load)("glNormalP3ui");
    glad_glNormalP3uiv = (PFNGLNORMALP3UIVPROC)(*load)("glNormalP3uiv");
    glad_glColorP3ui = (PFNGLCOLORP3UIPROC)(*load)("glColorP3ui");
    glad_glColorP3uiv = (PFNGLCOLORP3UIVPROC)(*load)("glColorP3uiv");
    glad_glColorP4ui = (PFNGLCOLORP4UIPROC)(*load)("glColorP4ui");
    glad_glColorP4uiv = (PFNGLCOLORP4UIVPROC)(*load)("glColorP4uiv");
    glad_glSecondaryColorP3ui = (PFNGLSECONDARYCOLORP3UIPROC)(*load)("glSecondaryColorP3ui");
    glad_glSecondaryColorP3uiv = (PFNGLSECONDARYCOLORP3UIVPROC)(*load)("glSecondaryColorP3uiv");
  }
  if (GLAD_GL_VERSION_4_0 != 0) {
    glad_glMinSampleShading = (PFNGLMINSAMPLESHADINGPROC)(*load)("glMinSampleShading");
    glad_glBlendEquationi = (PFNGLBLENDEQUATIONIPROC)(*load)("glBlendEquationi");
    glad_glBlendEquationSeparatei =
         (PFNGLBLENDEQUATIONSEPARATEIPROC)(*load)("glBlendEquationSeparatei");
    glad_glBlendFunci = (PFNGLBLENDFUNCIPROC)(*load)("glBlendFunci");
    glad_glBlendFuncSeparatei = (PFNGLBLENDFUNCSEPARATEIPROC)(*load)("glBlendFuncSeparatei");
    glad_glDrawArraysIndirect = (PFNGLDRAWARRAYSINDIRECTPROC)(*load)("glDrawArraysIndirect");
    glad_glDrawElementsIndirect = (PFNGLDRAWELEMENTSINDIRECTPROC)(*load)("glDrawElementsIndirect");
    glad_glUniform1d = (PFNGLUNIFORM1DPROC)(*load)("glUniform1d");
    glad_glUniform2d = (PFNGLUNIFORM2DPROC)(*load)("glUniform2d");
    glad_glUniform3d = (PFNGLUNIFORM3DPROC)(*load)("glUniform3d");
    glad_glUniform4d = (PFNGLUNIFORM4DPROC)(*load)("glUniform4d");
    glad_glUniform1dv = (PFNGLUNIFORM1DVPROC)(*load)("glUniform1dv");
    glad_glUniform2dv = (PFNGLUNIFORM2DVPROC)(*load)("glUniform2dv");
    glad_glUniform3dv = (PFNGLUNIFORM3DVPROC)(*load)("glUniform3dv");
    glad_glUniform4dv = (PFNGLUNIFORM4DVPROC)(*load)("glUniform4dv");
    glad_glUniformMatrix2dv = (PFNGLUNIFORMMATRIX2DVPROC)(*load)("glUniformMatrix2dv");
    glad_glUniformMatrix3dv = (PFNGLUNIFORMMATRIX3DVPROC)(*load)("glUniformMatrix3dv");
    glad_glUniformMatrix4dv = (PFNGLUNIFORMMATRIX4DVPROC)(*load)("glUniformMatrix4dv");
    glad_glUniformMatrix2x3dv = (PFNGLUNIFORMMATRIX2X3DVPROC)(*load)("glUniformMatrix2x3dv");
    glad_glUniformMatrix2x4dv = (PFNGLUNIFORMMATRIX2X4DVPROC)(*load)("glUniformMatrix2x4dv");
    glad_glUniformMatrix3x2dv = (PFNGLUNIFORMMATRIX3X2DVPROC)(*load)("glUniformMatrix3x2dv");
    glad_glUniformMatrix3x4dv = (PFNGLUNIFORMMATRIX3X4DVPROC)(*load)("glUniformMatrix3x4dv");
    glad_glUniformMatrix4x2dv = (PFNGLUNIFORMMATRIX4X2DVPROC)(*load)("glUniformMatrix4x2dv");
    glad_glUniformMatrix4x3dv = (PFNGLUNIFORMMATRIX4X3DVPROC)(*load)("glUniformMatrix4x3dv");
    glad_glGetUniformdv = (PFNGLGETUNIFORMDVPROC)(*load)("glGetUniformdv");
    glad_glGetSubroutineUniformLocation =
         (PFNGLGETSUBROUTINEUNIFORMLOCATIONPROC)(*load)("glGetSubroutineUniformLocation");
    glad_glGetSubroutineIndex = (PFNGLGETSUBROUTINEINDEXPROC)(*load)("glGetSubroutineIndex");
    glad_glGetActiveSubroutineUniformiv =
         (PFNGLGETACTIVESUBROUTINEUNIFORMIVPROC)(*load)("glGetActiveSubroutineUniformiv");
    glad_glGetActiveSubroutineUniformName =
         (PFNGLGETACTIVESUBROUTINEUNIFORMNAMEPROC)(*load)("glGetActiveSubroutineUniformName");
    glad_glGetActiveSubroutineName =
         (PFNGLGETACTIVESUBROUTINENAMEPROC)(*load)("glGetActiveSubroutineName");
    glad_glUniformSubroutinesuiv =
         (PFNGLUNIFORMSUBROUTINESUIVPROC)(*load)("glUniformSubroutinesuiv");
    glad_glGetUniformSubroutineuiv =
         (PFNGLGETUNIFORMSUBROUTINEUIVPROC)(*load)("glGetUniformSubroutineuiv");
    glad_glGetProgramStageiv = (PFNGLGETPROGRAMSTAGEIVPROC)(*load)("glGetProgramStageiv");
    glad_glPatchParameteri = (PFNGLPATCHPARAMETERIPROC)(*load)("glPatchParameteri");
    glad_glPatchParameterfv = (PFNGLPATCHPARAMETERFVPROC)(*load)("glPatchParameterfv");
    glad_glBindTransformFeedback =
         (PFNGLBINDTRANSFORMFEEDBACKPROC)(*load)("glBindTransformFeedback");
    glad_glDeleteTransformFeedbacks =
         (PFNGLDELETETRANSFORMFEEDBACKSPROC)(*load)("glDeleteTransformFeedbacks");
    glad_glGenTransformFeedbacks =
         (PFNGLGENTRANSFORMFEEDBACKSPROC)(*load)("glGenTransformFeedbacks");
    glad_glIsTransformFeedback = (PFNGLISTRANSFORMFEEDBACKPROC)(*load)("glIsTransformFeedback");
    glad_glPauseTransformFeedback =
         (PFNGLPAUSETRANSFORMFEEDBACKPROC)(*load)("glPauseTransformFeedback");
    glad_glResumeTransformFeedback =
         (PFNGLRESUMETRANSFORMFEEDBACKPROC)(*load)("glResumeTransformFeedback");
    glad_glDrawTransformFeedback =
         (PFNGLDRAWTRANSFORMFEEDBACKPROC)(*load)("glDrawTransformFeedback");
    glad_glDrawTransformFeedbackStream =
         (PFNGLDRAWTRANSFORMFEEDBACKSTREAMPROC)(*load)("glDrawTransformFeedbackStream");
    glad_glBeginQueryIndexed = (PFNGLBEGINQUERYINDEXEDPROC)(*load)("glBeginQueryIndexed");
    glad_glEndQueryIndexed = (PFNGLENDQUERYINDEXEDPROC)(*load)("glEndQueryIndexed");
    glad_glGetQueryIndexediv = (PFNGLGETQUERYINDEXEDIVPROC)(*load)("glGetQueryIndexediv");
  }
  if (GLAD_GL_VERSION_4_1 != 0) {
    glad_glReleaseShaderCompiler =
         (PFNGLRELEASESHADERCOMPILERPROC)(*load)("glReleaseShaderCompiler");
    glad_glShaderBinary = (PFNGLSHADERBINARYPROC)(*load)("glShaderBinary");
    glad_glGetShaderPrecisionFormat =
         (PFNGLGETSHADERPRECISIONFORMATPROC)(*load)("glGetShaderPrecisionFormat");
    glad_glDepthRangef = (PFNGLDEPTHRANGEFPROC)(*load)("glDepthRangef");
    glad_glClearDepthf = (PFNGLCLEARDEPTHFPROC)(*load)("glClearDepthf");
    glad_glGetProgramBinary = (PFNGLGETPROGRAMBINARYPROC)(*load)("glGetProgramBinary");
    glad_glProgramBinary = (PFNGLPROGRAMBINARYPROC)(*load)("glProgramBinary");
    glad_glProgramParameteri = (PFNGLPROGRAMPARAMETERIPROC)(*load)("glProgramParameteri");
    glad_glUseProgramStages = (PFNGLUSEPROGRAMSTAGESPROC)(*load)("glUseProgramStages");
    glad_glActiveShaderProgram = (PFNGLACTIVESHADERPROGRAMPROC)(*load)("glActiveShaderProgram");
    glad_glCreateShaderProgramv = (PFNGLCREATESHADERPROGRAMVPROC)(*load)("glCreateShaderProgramv");
    glad_glBindProgramPipeline = (PFNGLBINDPROGRAMPIPELINEPROC)(*load)("glBindProgramPipeline");
    glad_glDeleteProgramPipelines =
         (PFNGLDELETEPROGRAMPIPELINESPROC)(*load)("glDeleteProgramPipelines");
    glad_glGenProgramPipelines = (PFNGLGENPROGRAMPIPELINESPROC)(*load)("glGenProgramPipelines");
    glad_glIsProgramPipeline = (PFNGLISPROGRAMPIPELINEPROC)(*load)("glIsProgramPipeline");
    glad_glGetProgramPipelineiv = (PFNGLGETPROGRAMPIPELINEIVPROC)(*load)("glGetProgramPipelineiv");
    glad_glProgramParameteri = (PFNGLPROGRAMPARAMETERIPROC)(*load)("glProgramParameteri");
    glad_glProgramUniform1i = (PFNGLPROGRAMUNIFORM1IPROC)(*load)("glProgramUniform1i");
    glad_glProgramUniform1iv = (PFNGLPROGRAMUNIFORM1IVPROC)(*load)("glProgramUniform1iv");
    glad_glProgramUniform1f = (PFNGLPROGRAMUNIFORM1FPROC)(*load)("glProgramUniform1f");
    glad_glProgramUniform1fv = (PFNGLPROGRAMUNIFORM1FVPROC)(*load)("glProgramUniform1fv");
    glad_glProgramUniform1d = (PFNGLPROGRAMUNIFORM1DPROC)(*load)("glProgramUniform1d");
    glad_glProgramUniform1dv = (PFNGLPROGRAMUNIFORM1DVPROC)(*load)("glProgramUniform1dv");
    glad_glProgramUniform1ui = (PFNGLPROGRAMUNIFORM1UIPROC)(*load)("glProgramUniform1ui");
    glad_glProgramUniform1uiv = (PFNGLPROGRAMUNIFORM1UIVPROC)(*load)("glProgramUniform1uiv");
    glad_glProgramUniform2i = (PFNGLPROGRAMUNIFORM2IPROC)(*load)("glProgramUniform2i");
    glad_glProgramUniform2iv = (PFNGLPROGRAMUNIFORM2IVPROC)(*load)("glProgramUniform2iv");
    glad_glProgramUniform2f = (PFNGLPROGRAMUNIFORM2FPROC)(*load)("glProgramUniform2f");
    glad_glProgramUniform2fv = (PFNGLPROGRAMUNIFORM2FVPROC)(*load)("glProgramUniform2fv");
    glad_glProgramUniform2d = (PFNGLPROGRAMUNIFORM2DPROC)(*load)("glProgramUniform2d");
    glad_glProgramUniform2dv = (PFNGLPROGRAMUNIFORM2DVPROC)(*load)("glProgramUniform2dv");
    glad_glProgramUniform2ui = (PFNGLPROGRAMUNIFORM2UIPROC)(*load)("glProgramUniform2ui");
    glad_glProgramUniform2uiv = (PFNGLPROGRAMUNIFORM2UIVPROC)(*load)("glProgramUniform2uiv");
    glad_glProgramUniform3i = (PFNGLPROGRAMUNIFORM3IPROC)(*load)("glProgramUniform3i");
    glad_glProgramUniform3iv = (PFNGLPROGRAMUNIFORM3IVPROC)(*load)("glProgramUniform3iv");
    glad_glProgramUniform3f = (PFNGLPROGRAMUNIFORM3FPROC)(*load)("glProgramUniform3f");
    glad_glProgramUniform3fv = (PFNGLPROGRAMUNIFORM3FVPROC)(*load)("glProgramUniform3fv");
    glad_glProgramUniform3d = (PFNGLPROGRAMUNIFORM3DPROC)(*load)("glProgramUniform3d");
    glad_glProgramUniform3dv = (PFNGLPROGRAMUNIFORM3DVPROC)(*load)("glProgramUniform3dv");
    glad_glProgramUniform3ui = (PFNGLPROGRAMUNIFORM3UIPROC)(*load)("glProgramUniform3ui");
    glad_glProgramUniform3uiv = (PFNGLPROGRAMUNIFORM3UIVPROC)(*load)("glProgramUniform3uiv");
    glad_glProgramUniform4i = (PFNGLPROGRAMUNIFORM4IPROC)(*load)("glProgramUniform4i");
    glad_glProgramUniform4iv = (PFNGLPROGRAMUNIFORM4IVPROC)(*load)("glProgramUniform4iv");
    glad_glProgramUniform4f = (PFNGLPROGRAMUNIFORM4FPROC)(*load)("glProgramUniform4f");
    glad_glProgramUniform4fv = (PFNGLPROGRAMUNIFORM4FVPROC)(*load)("glProgramUniform4fv");
    glad_glProgramUniform4d = (PFNGLPROGRAMUNIFORM4DPROC)(*load)("glProgramUniform4d");
    glad_glProgramUniform4dv = (PFNGLPROGRAMUNIFORM4DVPROC)(*load)("glProgramUniform4dv");
    glad_glProgramUniform4ui = (PFNGLPROGRAMUNIFORM4UIPROC)(*load)("glProgramUniform4ui");
    glad_glProgramUniform4uiv = (PFNGLPROGRAMUNIFORM4UIVPROC)(*load)("glProgramUniform4uiv");
    glad_glProgramUniformMatrix2fv =
         (PFNGLPROGRAMUNIFORMMATRIX2FVPROC)(*load)("glProgramUniformMatrix2fv");
    glad_glProgramUniformMatrix3fv =
         (PFNGLPROGRAMUNIFORMMATRIX3FVPROC)(*load)("glProgramUniformMatrix3fv");
    glad_glProgramUniformMatrix4fv =
         (PFNGLPROGRAMUNIFORMMATRIX4FVPROC)(*load)("glProgramUniformMatrix4fv");
    glad_glProgramUniformMatrix2dv =
         (PFNGLPROGRAMUNIFORMMATRIX2DVPROC)(*load)("glProgramUniformMatrix2dv");
    glad_glProgramUniformMatrix3dv =
         (PFNGLPROGRAMUNIFORMMATRIX3DVPROC)(*load)("glProgramUniformMatrix3dv");
    glad_glProgramUniformMatrix4dv =
         (PFNGLPROGRAMUNIFORMMATRIX4DVPROC)(*load)("glProgramUniformMatrix4dv");
    glad_glProgramUniformMatrix2x3fv =
         (PFNGLPROGRAMUNIFORMMATRIX2X3FVPROC)(*load)("glProgramUniformMatrix2x3fv");
    glad_glProgramUniformMatrix3x2fv =
         (PFNGLPROGRAMUNIFORMMATRIX3X2FVPROC)(*load)("glProgramUniformMatrix3x2fv");
    glad_glProgramUniformMatrix2x4fv =
         (PFNGLPROGRAMUNIFORMMATRIX2X4FVPROC)(*load)("glProgramUniformMatrix2x4fv");
    glad_glProgramUniformMatrix4x2fv =
         (PFNGLPROGRAMUNIFORMMATRIX4X2FVPROC)(*load)("glProgramUniformMatrix4x2fv");
    glad_glProgramUniformMatrix3x4fv =
         (PFNGLPROGRAMUNIFORMMATRIX3X4FVPROC)(*load)("glProgramUniformMatrix3x4fv");
    glad_glProgramUniformMatrix4x3fv =
         (PFNGLPROGRAMUNIFORMMATRIX4X3FVPROC)(*load)("glProgramUniformMatrix4x3fv");
    glad_glProgramUniformMatrix2x3dv =
         (PFNGLPROGRAMUNIFORMMATRIX2X3DVPROC)(*load)("glProgramUniformMatrix2x3dv");
    glad_glProgramUniformMatrix3x2dv =
         (PFNGLPROGRAMUNIFORMMATRIX3X2DVPROC)(*load)("glProgramUniformMatrix3x2dv");
    glad_glProgramUniformMatrix2x4dv =
         (PFNGLPROGRAMUNIFORMMATRIX2X4DVPROC)(*load)("glProgramUniformMatrix2x4dv");
    glad_glProgramUniformMatrix4x2dv =
         (PFNGLPROGRAMUNIFORMMATRIX4X2DVPROC)(*load)("glProgramUniformMatrix4x2dv");
    glad_glProgramUniformMatrix3x4dv =
         (PFNGLPROGRAMUNIFORMMATRIX3X4DVPROC)(*load)("glProgramUniformMatrix3x4dv");
    glad_glProgramUniformMatrix4x3dv =
         (PFNGLPROGRAMUNIFORMMATRIX4X3DVPROC)(*load)("glProgramUniformMatrix4x3dv");
    glad_glValidateProgramPipeline =
         (PFNGLVALIDATEPROGRAMPIPELINEPROC)(*load)("glValidateProgramPipeline");
    glad_glGetProgramPipelineInfoLog =
         (PFNGLGETPROGRAMPIPELINEINFOLOGPROC)(*load)("glGetProgramPipelineInfoLog");
    glad_glVertexAttribL1d = (PFNGLVERTEXATTRIBL1DPROC)(*load)("glVertexAttribL1d");
    glad_glVertexAttribL2d = (PFNGLVERTEXATTRIBL2DPROC)(*load)("glVertexAttribL2d");
    glad_glVertexAttribL3d = (PFNGLVERTEXATTRIBL3DPROC)(*load)("glVertexAttribL3d");
    glad_glVertexAttribL4d = (PFNGLVERTEXATTRIBL4DPROC)(*load)("glVertexAttribL4d");
    glad_glVertexAttribL1dv = (PFNGLVERTEXATTRIBL1DVPROC)(*load)("glVertexAttribL1dv");
    glad_glVertexAttribL2dv = (PFNGLVERTEXATTRIBL2DVPROC)(*load)("glVertexAttribL2dv");
    glad_glVertexAttribL3dv = (PFNGLVERTEXATTRIBL3DVPROC)(*load)("glVertexAttribL3dv");
    glad_glVertexAttribL4dv = (PFNGLVERTEXATTRIBL4DVPROC)(*load)("glVertexAttribL4dv");
    glad_glVertexAttribLPointer = (PFNGLVERTEXATTRIBLPOINTERPROC)(*load)("glVertexAttribLPointer");
    glad_glGetVertexAttribLdv = (PFNGLGETVERTEXATTRIBLDVPROC)(*load)("glGetVertexAttribLdv");
    glad_glViewportArrayv = (PFNGLVIEWPORTARRAYVPROC)(*load)("glViewportArrayv");
    glad_glViewportIndexedf = (PFNGLVIEWPORTINDEXEDFPROC)(*load)("glViewportIndexedf");
    glad_glViewportIndexedfv = (PFNGLVIEWPORTINDEXEDFVPROC)(*load)("glViewportIndexedfv");
    glad_glScissorArrayv = (PFNGLSCISSORARRAYVPROC)(*load)("glScissorArrayv");
    glad_glScissorIndexed = (PFNGLSCISSORINDEXEDPROC)(*load)("glScissorIndexed");
    glad_glScissorIndexedv = (PFNGLSCISSORINDEXEDVPROC)(*load)("glScissorIndexedv");
    glad_glDepthRangeArrayv = (PFNGLDEPTHRANGEARRAYVPROC)(*load)("glDepthRangeArrayv");
    glad_glDepthRangeIndexed = (PFNGLDEPTHRANGEINDEXEDPROC)(*load)("glDepthRangeIndexed");
    glad_glGetFloati_v = (PFNGLGETFLOATI_VPROC)(*load)("glGetFloati_v");
    glad_glGetDoublei_v = (PFNGLGETDOUBLEI_VPROC)(*load)("glGetDoublei_v");
  }
  if (GLAD_GL_VERSION_4_2 != 0) {
    glad_glDrawArraysInstancedBaseInstance =
         (PFNGLDRAWARRAYSINSTANCEDBASEINSTANCEPROC)(*load)("glDrawArraysInstancedBaseInstance");
    glad_glDrawElementsInstancedBaseInstance =
         (PFNGLDRAWELEMENTSINSTANCEDBASEINSTANCEPROC)(*load)("glDrawElementsInstancedBaseInstance");
    glad_glDrawElementsInstancedBaseVertexBaseInstance =
         (PFNGLDRAWELEMENTSINSTANCEDBASEVERTEXBASEINSTANCEPROC)
         (*load)("glDrawElementsInstancedBaseVertexBaseInstance");
    glad_glGetInternalformativ = (PFNGLGETINTERNALFORMATIVPROC)(*load)("glGetInternalformativ");
    glad_glGetActiveAtomicCounterBufferiv =
         (PFNGLGETACTIVEATOMICCOUNTERBUFFERIVPROC)(*load)("glGetActiveAtomicCounterBufferiv");
    glad_glBindImageTexture = (PFNGLBINDIMAGETEXTUREPROC)(*load)("glBindImageTexture");
    glad_glMemoryBarrier = (PFNGLMEMORYBARRIERPROC)(*load)("glMemoryBarrier");
    glad_glTexStorage1D = (PFNGLTEXSTORAGE1DPROC)(*load)("glTexStorage1D");
    glad_glTexStorage2D = (PFNGLTEXSTORAGE2DPROC)(*load)("glTexStorage2D");
    glad_glTexStorage3D = (PFNGLTEXSTORAGE3DPROC)(*load)("glTexStorage3D");
    glad_glDrawTransformFeedbackInstanced =
         (PFNGLDRAWTRANSFORMFEEDBACKINSTANCEDPROC)(*load)("glDrawTransformFeedbackInstanced");
    glad_glDrawTransformFeedbackStreamInstanced =
         (PFNGLDRAWTRANSFORMFEEDBACKSTREAMINSTANCEDPROC)
         (*load)("glDrawTransformFeedbackStreamInstanced");
  }
  if (GLAD_GL_VERSION_4_3 != 0) {
    glad_glClearBufferData = (PFNGLCLEARBUFFERDATAPROC)(*load)("glClearBufferData");
    glad_glClearBufferSubData = (PFNGLCLEARBUFFERSUBDATAPROC)(*load)("glClearBufferSubData");
    glad_glDispatchCompute = (PFNGLDISPATCHCOMPUTEPROC)(*load)("glDispatchCompute");
    glad_glDispatchComputeIndirect =
         (PFNGLDISPATCHCOMPUTEINDIRECTPROC)(*load)("glDispatchComputeIndirect");
    glad_glCopyImageSubData = (PFNGLCOPYIMAGESUBDATAPROC)(*load)("glCopyImageSubData");
    glad_glFramebufferParameteri =
         (PFNGLFRAMEBUFFERPARAMETERIPROC)(*load)("glFramebufferParameteri");
    glad_glGetFramebufferParameteriv =
         (PFNGLGETFRAMEBUFFERPARAMETERIVPROC)(*load)("glGetFramebufferParameteriv");
    glad_glGetInternalformati64v =
         (PFNGLGETINTERNALFORMATI64VPROC)(*load)("glGetInternalformati64v");
    glad_glInvalidateTexSubImage =
         (PFNGLINVALIDATETEXSUBIMAGEPROC)(*load)("glInvalidateTexSubImage");
    glad_glInvalidateTexImage = (PFNGLINVALIDATETEXIMAGEPROC)(*load)("glInvalidateTexImage");
    glad_glInvalidateBufferSubData =
         (PFNGLINVALIDATEBUFFERSUBDATAPROC)(*load)("glInvalidateBufferSubData");
    glad_glInvalidateBufferData = (PFNGLINVALIDATEBUFFERDATAPROC)(*load)("glInvalidateBufferData");
    glad_glInvalidateFramebuffer =
         (PFNGLINVALIDATEFRAMEBUFFERPROC)(*load)("glInvalidateFramebuffer");
    glad_glInvalidateSubFramebuffer =
         (PFNGLINVALIDATESUBFRAMEBUFFERPROC)(*load)("glInvalidateSubFramebuffer");
    glad_glMultiDrawArraysIndirect =
         (PFNGLMULTIDRAWARRAYSINDIRECTPROC)(*load)("glMultiDrawArraysIndirect");
    glad_glMultiDrawElementsIndirect =
         (PFNGLMULTIDRAWELEMENTSINDIRECTPROC)(*load)("glMultiDrawElementsIndirect");
    glad_glGetProgramInterfaceiv =
         (PFNGLGETPROGRAMINTERFACEIVPROC)(*load)("glGetProgramInterfaceiv");
    glad_glGetProgramResourceIndex =
         (PFNGLGETPROGRAMRESOURCEINDEXPROC)(*load)("glGetProgramResourceIndex");
    glad_glGetProgramResourceName =
         (PFNGLGETPROGRAMRESOURCENAMEPROC)(*load)("glGetProgramResourceName");
    glad_glGetProgramResourceiv = (PFNGLGETPROGRAMRESOURCEIVPROC)(*load)("glGetProgramResourceiv");
    glad_glGetProgramResourceLocation =
         (PFNGLGETPROGRAMRESOURCELOCATIONPROC)(*load)("glGetProgramResourceLocation");
    glad_glGetProgramResourceLocationIndex =
         (PFNGLGETPROGRAMRESOURCELOCATIONINDEXPROC)(*load)("glGetProgramResourceLocationIndex");
    glad_glShaderStorageBlockBinding =
         (PFNGLSHADERSTORAGEBLOCKBINDINGPROC)(*load)("glShaderStorageBlockBinding");
    glad_glTexBufferRange = (PFNGLTEXBUFFERRANGEPROC)(*load)("glTexBufferRange");
    glad_glTexStorage2DMultisample =
         (PFNGLTEXSTORAGE2DMULTISAMPLEPROC)(*load)("glTexStorage2DMultisample");
    glad_glTexStorage3DMultisample =
         (PFNGLTEXSTORAGE3DMULTISAMPLEPROC)(*load)("glTexStorage3DMultisample");
    glad_glTextureView = (PFNGLTEXTUREVIEWPROC)(*load)("glTextureView");
    glad_glBindVertexBuffer = (PFNGLBINDVERTEXBUFFERPROC)(*load)("glBindVertexBuffer");
    glad_glVertexAttribFormat = (PFNGLVERTEXATTRIBFORMATPROC)(*load)("glVertexAttribFormat");
    glad_glVertexAttribIFormat = (PFNGLVERTEXATTRIBIFORMATPROC)(*load)("glVertexAttribIFormat");
    glad_glVertexAttribLFormat = (PFNGLVERTEXATTRIBLFORMATPROC)(*load)("glVertexAttribLFormat");
    glad_glVertexAttribBinding = (PFNGLVERTEXATTRIBBINDINGPROC)(*load)("glVertexAttribBinding");
    glad_glVertexBindingDivisor = (PFNGLVERTEXBINDINGDIVISORPROC)(*load)("glVertexBindingDivisor");
    glad_glDebugMessageControl = (PFNGLDEBUGMESSAGECONTROLPROC)(*load)("glDebugMessageControl");
    glad_glDebugMessageInsert = (PFNGLDEBUGMESSAGEINSERTPROC)(*load)("glDebugMessageInsert");
    glad_glDebugMessageCallback = (PFNGLDEBUGMESSAGECALLBACKPROC)(*load)("glDebugMessageCallback");
    glad_glGetDebugMessageLog = (PFNGLGETDEBUGMESSAGELOGPROC)(*load)("glGetDebugMessageLog");
    glad_glPushDebugGroup = (PFNGLPUSHDEBUGGROUPPROC)(*load)("glPushDebugGroup");
    glad_glPopDebugGroup = (PFNGLPOPDEBUGGROUPPROC)(*load)("glPopDebugGroup");
    glad_glObjectLabel = (PFNGLOBJECTLABELPROC)(*load)("glObjectLabel");
    glad_glGetObjectLabel = (PFNGLGETOBJECTLABELPROC)(*load)("glGetObjectLabel");
    glad_glObjectPtrLabel = (PFNGLOBJECTPTRLABELPROC)(*load)("glObjectPtrLabel");
    glad_glGetObjectPtrLabel = (PFNGLGETOBJECTPTRLABELPROC)(*load)("glGetObjectPtrLabel");
    glad_glGetPointerv = (PFNGLGETPOINTERVPROC)(*load)("glGetPointerv");
  }
  if (GLAD_GL_VERSION_4_4 != 0) {
    glad_glBufferStorage = (PFNGLBUFFERSTORAGEPROC)(*load)("glBufferStorage");
    glad_glClearTexImage = (PFNGLCLEARTEXIMAGEPROC)(*load)("glClearTexImage");
    glad_glClearTexSubImage = (PFNGLCLEARTEXSUBIMAGEPROC)(*load)("glClearTexSubImage");
    glad_glBindBuffersBase = (PFNGLBINDBUFFERSBASEPROC)(*load)("glBindBuffersBase");
    glad_glBindBuffersRange = (PFNGLBINDBUFFERSRANGEPROC)(*load)("glBindBuffersRange");
    glad_glBindTextures = (PFNGLBINDTEXTURESPROC)(*load)("glBindTextures");
    glad_glBindSamplers = (PFNGLBINDSAMPLERSPROC)(*load)("glBindSamplers");
    glad_glBindImageTextures = (PFNGLBINDIMAGETEXTURESPROC)(*load)("glBindImageTextures");
    glad_glBindVertexBuffers = (PFNGLBINDVERTEXBUFFERSPROC)(*load)("glBindVertexBuffers");
  }
  if (GLAD_GL_VERSION_4_5 != 0) {
    glad_glClipControl = (PFNGLCLIPCONTROLPROC)(*load)("glClipControl");
    glad_glCreateTransformFeedbacks =
         (PFNGLCREATETRANSFORMFEEDBACKSPROC)(*load)("glCreateTransformFeedbacks");
    glad_glTransformFeedbackBufferBase =
         (PFNGLTRANSFORMFEEDBACKBUFFERBASEPROC)(*load)("glTransformFeedbackBufferBase");
    glad_glTransformFeedbackBufferRange =
         (PFNGLTRANSFORMFEEDBACKBUFFERRANGEPROC)(*load)("glTransformFeedbackBufferRange");
    glad_glGetTransformFeedbackiv =
         (PFNGLGETTRANSFORMFEEDBACKIVPROC)(*load)("glGetTransformFeedbackiv");
    glad_glGetTransformFeedbacki_v =
         (PFNGLGETTRANSFORMFEEDBACKI_VPROC)(*load)("glGetTransformFeedbacki_v");
    glad_glGetTransformFeedbacki64_v =
         (PFNGLGETTRANSFORMFEEDBACKI64_VPROC)(*load)("glGetTransformFeedbacki64_v");
    glad_glCreateBuffers = (PFNGLCREATEBUFFERSPROC)(*load)("glCreateBuffers");
    glad_glNamedBufferStorage = (PFNGLNAMEDBUFFERSTORAGEPROC)(*load)("glNamedBufferStorage");
    glad_glNamedBufferData = (PFNGLNAMEDBUFFERDATAPROC)(*load)("glNamedBufferData");
    glad_glNamedBufferSubData = (PFNGLNAMEDBUFFERSUBDATAPROC)(*load)("glNamedBufferSubData");
    glad_glCopyNamedBufferSubData =
         (PFNGLCOPYNAMEDBUFFERSUBDATAPROC)(*load)("glCopyNamedBufferSubData");
    glad_glClearNamedBufferData = (PFNGLCLEARNAMEDBUFFERDATAPROC)(*load)("glClearNamedBufferData");
    glad_glClearNamedBufferSubData =
         (PFNGLCLEARNAMEDBUFFERSUBDATAPROC)(*load)("glClearNamedBufferSubData");
    glad_glMapNamedBuffer = (PFNGLMAPNAMEDBUFFERPROC)(*load)("glMapNamedBuffer");
    glad_glMapNamedBufferRange = (PFNGLMAPNAMEDBUFFERRANGEPROC)(*load)("glMapNamedBufferRange");
    glad_glUnmapNamedBuffer = (PFNGLUNMAPNAMEDBUFFERPROC)(*load)("glUnmapNamedBuffer");
    glad_glFlushMappedNamedBufferRange =
         (PFNGLFLUSHMAPPEDNAMEDBUFFERRANGEPROC)(*load)("glFlushMappedNamedBufferRange");
    glad_glGetNamedBufferParameteriv =
         (PFNGLGETNAMEDBUFFERPARAMETERIVPROC)(*load)("glGetNamedBufferParameteriv");
    glad_glGetNamedBufferParameteri64v =
         (PFNGLGETNAMEDBUFFERPARAMETERI64VPROC)(*load)("glGetNamedBufferParameteri64v");
    glad_glGetNamedBufferPointerv =
         (PFNGLGETNAMEDBUFFERPOINTERVPROC)(*load)("glGetNamedBufferPointerv");
    glad_glGetNamedBufferSubData =
         (PFNGLGETNAMEDBUFFERSUBDATAPROC)(*load)("glGetNamedBufferSubData");
    glad_glCreateFramebuffers = (PFNGLCREATEFRAMEBUFFERSPROC)(*load)("glCreateFramebuffers");
    glad_glNamedFramebufferRenderbuffer =
         (PFNGLNAMEDFRAMEBUFFERRENDERBUFFERPROC)(*load)("glNamedFramebufferRenderbuffer");
    glad_glNamedFramebufferParameteri =
         (PFNGLNAMEDFRAMEBUFFERPARAMETERIPROC)(*load)("glNamedFramebufferParameteri");
    glad_glNamedFramebufferTexture =
         (PFNGLNAMEDFRAMEBUFFERTEXTUREPROC)(*load)("glNamedFramebufferTexture");
    glad_glNamedFramebufferTextureLayer =
         (PFNGLNAMEDFRAMEBUFFERTEXTURELAYERPROC)(*load)("glNamedFramebufferTextureLayer");
    glad_glNamedFramebufferDrawBuffer =
         (PFNGLNAMEDFRAMEBUFFERDRAWBUFFERPROC)(*load)("glNamedFramebufferDrawBuffer");
    glad_glNamedFramebufferDrawBuffers =
         (PFNGLNAMEDFRAMEBUFFERDRAWBUFFERSPROC)(*load)("glNamedFramebufferDrawBuffers");
    glad_glNamedFramebufferReadBuffer =
         (PFNGLNAMEDFRAMEBUFFERREADBUFFERPROC)(*load)("glNamedFramebufferReadBuffer");
    glad_glInvalidateNamedFramebufferData =
         (PFNGLINVALIDATENAMEDFRAMEBUFFERDATAPROC)(*load)("glInvalidateNamedFramebufferData");
    glad_glInvalidateNamedFramebufferSubData =
         (PFNGLINVALIDATENAMEDFRAMEBUFFERSUBDATAPROC)(*load)("glInvalidateNamedFramebufferSubData");
    glad_glClearNamedFramebufferiv =
         (PFNGLCLEARNAMEDFRAMEBUFFERIVPROC)(*load)("glClearNamedFramebufferiv");
    glad_glClearNamedFramebufferuiv =
         (PFNGLCLEARNAMEDFRAMEBUFFERUIVPROC)(*load)("glClearNamedFramebufferuiv");
    glad_glClearNamedFramebufferfv =
         (PFNGLCLEARNAMEDFRAMEBUFFERFVPROC)(*load)("glClearNamedFramebufferfv");
    glad_glClearNamedFramebufferfi =
         (PFNGLCLEARNAMEDFRAMEBUFFERFIPROC)(*load)("glClearNamedFramebufferfi");
    glad_glBlitNamedFramebuffer = (PFNGLBLITNAMEDFRAMEBUFFERPROC)(*load)("glBlitNamedFramebuffer");
    glad_glCheckNamedFramebufferStatus =
         (PFNGLCHECKNAMEDFRAMEBUFFERSTATUSPROC)(*load)("glCheckNamedFramebufferStatus");
    glad_glGetNamedFramebufferParameteriv =
         (PFNGLGETNAMEDFRAMEBUFFERPARAMETERIVPROC)(*load)("glGetNamedFramebufferParameteriv");
    glad_glGetNamedFramebufferAttachmentParameteriv =
         (PFNGLGETNAMEDFRAMEBUFFERATTACHMENTPARAMETERIVPROC)
         (*load)("glGetNamedFramebufferAttachmentParameteriv");
    glad_glCreateRenderbuffers = (PFNGLCREATERENDERBUFFERSPROC)(*load)("glCreateRenderbuffers");
    glad_glNamedRenderbufferStorage =
         (PFNGLNAMEDRENDERBUFFERSTORAGEPROC)(*load)("glNamedRenderbufferStorage");
    glad_glNamedRenderbufferStorageMultisample =
         (PFNGLNAMEDRENDERBUFFERSTORAGEMULTISAMPLEPROC)
         (*load)("glNamedRenderbufferStorageMultisample");
    glad_glGetNamedRenderbufferParameteriv =
         (PFNGLGETNAMEDRENDERBUFFERPARAMETERIVPROC)(*load)("glGetNamedRenderbufferParameteriv");
    glad_glCreateTextures = (PFNGLCREATETEXTURESPROC)(*load)("glCreateTextures");
    glad_glTextureBuffer = (PFNGLTEXTUREBUFFERPROC)(*load)("glTextureBuffer");
    glad_glTextureBufferRange = (PFNGLTEXTUREBUFFERRANGEPROC)(*load)("glTextureBufferRange");
    glad_glTextureStorage1D = (PFNGLTEXTURESTORAGE1DPROC)(*load)("glTextureStorage1D");
    glad_glTextureStorage2D = (PFNGLTEXTURESTORAGE2DPROC)(*load)("glTextureStorage2D");
    glad_glTextureStorage3D = (PFNGLTEXTURESTORAGE3DPROC)(*load)("glTextureStorage3D");
    glad_glTextureStorage2DMultisample =
         (PFNGLTEXTURESTORAGE2DMULTISAMPLEPROC)(*load)("glTextureStorage2DMultisample");
    glad_glTextureStorage3DMultisample =
         (PFNGLTEXTURESTORAGE3DMULTISAMPLEPROC)(*load)("glTextureStorage3DMultisample");
    glad_glTextureSubImage1D = (PFNGLTEXTURESUBIMAGE1DPROC)(*load)("glTextureSubImage1D");
    glad_glTextureSubImage2D = (PFNGLTEXTURESUBIMAGE2DPROC)(*load)("glTextureSubImage2D");
    glad_glTextureSubImage3D = (PFNGLTEXTURESUBIMAGE3DPROC)(*load)("glTextureSubImage3D");
    glad_glCompressedTextureSubImage1D =
         (PFNGLCOMPRESSEDTEXTURESUBIMAGE1DPROC)(*load)("glCompressedTextureSubImage1D");
    glad_glCompressedTextureSubImage2D =
         (PFNGLCOMPRESSEDTEXTURESUBIMAGE2DPROC)(*load)("glCompressedTextureSubImage2D");
    glad_glCompressedTextureSubImage3D =
         (PFNGLCOMPRESSEDTEXTURESUBIMAGE3DPROC)(*load)("glCompressedTextureSubImage3D");
    glad_glCopyTextureSubImage1D =
         (PFNGLCOPYTEXTURESUBIMAGE1DPROC)(*load)("glCopyTextureSubImage1D");
    glad_glCopyTextureSubImage2D =
         (PFNGLCOPYTEXTURESUBIMAGE2DPROC)(*load)("glCopyTextureSubImage2D");
    glad_glCopyTextureSubImage3D =
         (PFNGLCOPYTEXTURESUBIMAGE3DPROC)(*load)("glCopyTextureSubImage3D");
    glad_glTextureParameterf = (PFNGLTEXTUREPARAMETERFPROC)(*load)("glTextureParameterf");
    glad_glTextureParameterfv = (PFNGLTEXTUREPARAMETERFVPROC)(*load)("glTextureParameterfv");
    glad_glTextureParameteri = (PFNGLTEXTUREPARAMETERIPROC)(*load)("glTextureParameteri");
    glad_glTextureParameterIiv = (PFNGLTEXTUREPARAMETERIIVPROC)(*load)("glTextureParameterIiv");
    glad_glTextureParameterIuiv = (PFNGLTEXTUREPARAMETERIUIVPROC)(*load)("glTextureParameterIuiv");
    glad_glTextureParameteriv = (PFNGLTEXTUREPARAMETERIVPROC)(*load)("glTextureParameteriv");
    glad_glGenerateTextureMipmap =
         (PFNGLGENERATETEXTUREMIPMAPPROC)(*load)("glGenerateTextureMipmap");
    glad_glBindTextureUnit = (PFNGLBINDTEXTUREUNITPROC)(*load)("glBindTextureUnit");
    glad_glGetTextureImage = (PFNGLGETTEXTUREIMAGEPROC)(*load)("glGetTextureImage");
    glad_glGetCompressedTextureImage =
         (PFNGLGETCOMPRESSEDTEXTUREIMAGEPROC)(*load)("glGetCompressedTextureImage");
    glad_glGetTextureLevelParameterfv =
         (PFNGLGETTEXTURELEVELPARAMETERFVPROC)(*load)("glGetTextureLevelParameterfv");
    glad_glGetTextureLevelParameteriv =
         (PFNGLGETTEXTURELEVELPARAMETERIVPROC)(*load)("glGetTextureLevelParameteriv");
    glad_glGetTextureParameterfv =
         (PFNGLGETTEXTUREPARAMETERFVPROC)(*load)("glGetTextureParameterfv");
    glad_glGetTextureParameterIiv =
         (PFNGLGETTEXTUREPARAMETERIIVPROC)(*load)("glGetTextureParameterIiv");
    glad_glGetTextureParameterIuiv =
         (PFNGLGETTEXTUREPARAMETERIUIVPROC)(*load)("glGetTextureParameterIuiv");
    glad_glGetTextureParameteriv =
         (PFNGLGETTEXTUREPARAMETERIVPROC)(*load)("glGetTextureParameteriv");
    glad_glCreateVertexArrays = (PFNGLCREATEVERTEXARRAYSPROC)(*load)("glCreateVertexArrays");
    glad_glDisableVertexArrayAttrib =
         (PFNGLDISABLEVERTEXARRAYATTRIBPROC)(*load)("glDisableVertexArrayAttrib");
    glad_glEnableVertexArrayAttrib =
         (PFNGLENABLEVERTEXARRAYATTRIBPROC)(*load)("glEnableVertexArrayAttrib");
    glad_glVertexArrayElementBuffer =
         (PFNGLVERTEXARRAYELEMENTBUFFERPROC)(*load)("glVertexArrayElementBuffer");
    glad_glVertexArrayVertexBuffer =
         (PFNGLVERTEXARRAYVERTEXBUFFERPROC)(*load)("glVertexArrayVertexBuffer");
    glad_glVertexArrayVertexBuffers =
         (PFNGLVERTEXARRAYVERTEXBUFFERSPROC)(*load)("glVertexArrayVertexBuffers");
    glad_glVertexArrayAttribBinding =
         (PFNGLVERTEXARRAYATTRIBBINDINGPROC)(*load)("glVertexArrayAttribBinding");
    glad_glVertexArrayAttribFormat =
         (PFNGLVERTEXARRAYATTRIBFORMATPROC)(*load)("glVertexArrayAttribFormat");
    glad_glVertexArrayAttribIFormat =
         (PFNGLVERTEXARRAYATTRIBIFORMATPROC)(*load)("glVertexArrayAttribIFormat");
    glad_glVertexArrayAttribLFormat =
         (PFNGLVERTEXARRAYATTRIBLFORMATPROC)(*load)("glVertexArrayAttribLFormat");
    glad_glVertexArrayBindingDivisor =
         (PFNGLVERTEXARRAYBINDINGDIVISORPROC)(*load)("glVertexArrayBindingDivisor");
    glad_glGetVertexArrayiv = (PFNGLGETVERTEXARRAYIVPROC)(*load)("glGetVertexArrayiv");
    glad_glGetVertexArrayIndexediv =
         (PFNGLGETVERTEXARRAYINDEXEDIVPROC)(*load)("glGetVertexArrayIndexediv");
    glad_glGetVertexArrayIndexed64iv =
         (PFNGLGETVERTEXARRAYINDEXED64IVPROC)(*load)("glGetVertexArrayIndexed64iv");
    glad_glCreateSamplers = (PFNGLCREATESAMPLERSPROC)(*load)("glCreateSamplers");
    glad_glCreateProgramPipelines =
         (PFNGLCREATEPROGRAMPIPELINESPROC)(*load)("glCreateProgramPipelines");
    glad_glCreateQueries = (PFNGLCREATEQUERIESPROC)(*load)("glCreateQueries");
    glad_glGetQueryBufferObjecti64v =
         (PFNGLGETQUERYBUFFEROBJECTI64VPROC)(*load)("glGetQueryBufferObjecti64v");
    glad_glGetQueryBufferObjectiv =
         (PFNGLGETQUERYBUFFEROBJECTIVPROC)(*load)("glGetQueryBufferObjectiv");
    glad_glGetQueryBufferObjectui64v =
         (PFNGLGETQUERYBUFFEROBJECTUI64VPROC)(*load)("glGetQueryBufferObjectui64v");
    glad_glGetQueryBufferObjectuiv =
         (PFNGLGETQUERYBUFFEROBJECTUIVPROC)(*load)("glGetQueryBufferObjectuiv");
    glad_glMemoryBarrierByRegion =
         (PFNGLMEMORYBARRIERBYREGIONPROC)(*load)("glMemoryBarrierByRegion");
    glad_glGetTextureSubImage = (PFNGLGETTEXTURESUBIMAGEPROC)(*load)("glGetTextureSubImage");
    glad_glGetCompressedTextureSubImage =
         (PFNGLGETCOMPRESSEDTEXTURESUBIMAGEPROC)(*load)("glGetCompressedTextureSubImage");
    glad_glGetGraphicsResetStatus =
         (PFNGLGETGRAPHICSRESETSTATUSPROC)(*load)("glGetGraphicsResetStatus");
    glad_glGetnCompressedTexImage =
         (PFNGLGETNCOMPRESSEDTEXIMAGEPROC)(*load)("glGetnCompressedTexImage");
    glad_glGetnTexImage = (PFNGLGETNTEXIMAGEPROC)(*load)("glGetnTexImage");
    glad_glGetnUniformdv = (PFNGLGETNUNIFORMDVPROC)(*load)("glGetnUniformdv");
    glad_glGetnUniformfv = (PFNGLGETNUNIFORMFVPROC)(*load)("glGetnUniformfv");
    glad_glGetnUniformiv = (PFNGLGETNUNIFORMIVPROC)(*load)("glGetnUniformiv");
    glad_glGetnUniformuiv = (PFNGLGETNUNIFORMUIVPROC)(*load)("glGetnUniformuiv");
    glad_glReadnPixels = (PFNGLREADNPIXELSPROC)(*load)("glReadnPixels");
    glad_glGetnMapdv = (PFNGLGETNMAPDVPROC)(*load)("glGetnMapdv");
    glad_glGetnMapfv = (PFNGLGETNMAPFVPROC)(*load)("glGetnMapfv");
    glad_glGetnMapiv = (PFNGLGETNMAPIVPROC)(*load)("glGetnMapiv");
    glad_glGetnPixelMapfv = (PFNGLGETNPIXELMAPFVPROC)(*load)("glGetnPixelMapfv");
    glad_glGetnPixelMapuiv = (PFNGLGETNPIXELMAPUIVPROC)(*load)("glGetnPixelMapuiv");
    glad_glGetnPixelMapusv = (PFNGLGETNPIXELMAPUSVPROC)(*load)("glGetnPixelMapusv");
    glad_glGetnPolygonStipple = (PFNGLGETNPOLYGONSTIPPLEPROC)(*load)("glGetnPolygonStipple");
    glad_glGetnColorTable = (PFNGLGETNCOLORTABLEPROC)(*load)("glGetnColorTable");
    glad_glGetnConvolutionFilter =
         (PFNGLGETNCONVOLUTIONFILTERPROC)(*load)("glGetnConvolutionFilter");
    glad_glGetnSeparableFilter = (PFNGLGETNSEPARABLEFILTERPROC)(*load)("glGetnSeparableFilter");
    glad_glGetnHistogram = (PFNGLGETNHISTOGRAMPROC)(*load)("glGetnHistogram");
    glad_glGetnMinmax = (PFNGLGETNMINMAXPROC)(*load)("glGetnMinmax");
    glad_glTextureBarrier = (PFNGLTEXTUREBARRIERPROC)(*load)("glTextureBarrier");
  }
  if (GLAD_GL_VERSION_4_6 != 0) {
    glad_glSpecializeShader = (PFNGLSPECIALIZESHADERPROC)(*load)("glSpecializeShader");
    glad_glMultiDrawArraysIndirectCount =
         (PFNGLMULTIDRAWARRAYSINDIRECTCOUNTPROC)(*load)("glMultiDrawArraysIndirectCount");
    glad_glMultiDrawElementsIndirectCount =
         (PFNGLMULTIDRAWELEMENTSINDIRECTCOUNTPROC)(*load)("glMultiDrawElementsIndirectCount");
    glad_glPolygonOffsetClamp = (PFNGLPOLYGONOFFSETCLAMPPROC)(*load)("glPolygonOffsetClamp");
  }
  if (max_loaded_major < 3) {
    exts = (char *)(*glad_glGetString)(0x1f03);
  }
  else {
    num_exts_i = 0;
    (*glad_glGetIntegerv)(0x821d,&num_exts_i);
    iVar4 = num_exts_i;
    if (0 < (long)num_exts_i) {
      exts_i = (char **)malloc((long)num_exts_i * 8);
    }
    if (exts_i == (char **)0x0) {
      return 0;
    }
    if (iVar4 != 0) {
      uVar13 = 0;
      do {
        pGVar6 = (*glad_glGetStringi)(0x1f03,(GLuint)uVar13);
        sVar7 = strlen((char *)pGVar6);
        pcVar8 = (char *)malloc(sVar7 + 1);
        if (pcVar8 != (char *)0x0) {
          memcpy(pcVar8,pGVar6,sVar7 + 1);
        }
        exts_i[uVar13] = pcVar8;
        uVar13 = uVar13 + 1;
      } while (uVar13 < (uint)num_exts_i);
    }
  }
  ppcVar3 = exts_i;
  pbVar2 = (byte *)exts;
  if (max_loaded_major < 3) {
    iVar4 = 0;
    if (exts != (char *)0x0) {
      pbVar9 = (byte *)strstr(exts,"GL_ARB_bindless_texture");
      while (pbVar9 != (byte *)0x0) {
        __haystack = pbVar9 + 0x17;
        if (((pbVar9 == pbVar2) || (pbVar9[-1] == 0x20)) && ((*__haystack & 0xdf) == 0))
        goto LAB_00143f72;
        pbVar9 = (byte *)strstr((char *)__haystack,"GL_ARB_bindless_texture");
        pbVar2 = __haystack;
      }
    }
  }
  else {
    iVar4 = 0;
    if ((exts_i != (char **)0x0) && (lVar15 = (long)num_exts_i, 0 < lVar15)) {
      lVar12 = 0;
      do {
        if ((ppcVar3[lVar12] != (char *)0x0) &&
           (iVar4 = strcmp(ppcVar3[lVar12],"GL_ARB_bindless_texture"), iVar4 == 0))
        goto LAB_00143f72;
        lVar12 = lVar12 + 1;
      } while (lVar15 != lVar12);
      iVar4 = 0;
    }
  }
LAB_00143f77:
  ppcVar3 = exts_i;
  GLAD_GL_ARB_bindless_texture = iVar4;
  if (exts_i != (char **)0x0) {
    if (0 < num_exts_i) {
      lVar15 = 0;
      do {
        free(ppcVar3[lVar15]);
        lVar15 = lVar15 + 1;
      } while (lVar15 < num_exts_i);
    }
    free(ppcVar3);
    exts_i = (char **)0x0;
  }
  if (GLAD_GL_ARB_bindless_texture != 0) {
    glad_glGetTextureHandleARB = (PFNGLGETTEXTUREHANDLEARBPROC)(*load)("glGetTextureHandleARB");
    glad_glGetTextureSamplerHandleARB =
         (PFNGLGETTEXTURESAMPLERHANDLEARBPROC)(*load)("glGetTextureSamplerHandleARB");
    glad_glMakeTextureHandleResidentARB =
         (PFNGLMAKETEXTUREHANDLERESIDENTARBPROC)(*load)("glMakeTextureHandleResidentARB");
    glad_glMakeTextureHandleNonResidentARB =
         (PFNGLMAKETEXTUREHANDLENONRESIDENTARBPROC)(*load)("glMakeTextureHandleNonResidentARB");
    glad_glGetImageHandleARB = (PFNGLGETIMAGEHANDLEARBPROC)(*load)("glGetImageHandleARB");
    glad_glMakeImageHandleResidentARB =
         (PFNGLMAKEIMAGEHANDLERESIDENTARBPROC)(*load)("glMakeImageHandleResidentARB");
    glad_glMakeImageHandleNonResidentARB =
         (PFNGLMAKEIMAGEHANDLENONRESIDENTARBPROC)(*load)("glMakeImageHandleNonResidentARB");
    glad_glUniformHandleui64ARB = (PFNGLUNIFORMHANDLEUI64ARBPROC)(*load)("glUniformHandleui64ARB");
    glad_glUniformHandleui64vARB =
         (PFNGLUNIFORMHANDLEUI64VARBPROC)(*load)("glUniformHandleui64vARB");
    glad_glProgramUniformHandleui64ARB =
         (PFNGLPROGRAMUNIFORMHANDLEUI64ARBPROC)(*load)("glProgramUniformHandleui64ARB");
    glad_glProgramUniformHandleui64vARB =
         (PFNGLPROGRAMUNIFORMHANDLEUI64VARBPROC)(*load)("glProgramUniformHandleui64vARB");
    glad_glIsTextureHandleResidentARB =
         (PFNGLISTEXTUREHANDLERESIDENTARBPROC)(*load)("glIsTextureHandleResidentARB");
    glad_glIsImageHandleResidentARB =
         (PFNGLISIMAGEHANDLERESIDENTARBPROC)(*load)("glIsImageHandleResidentARB");
    glad_glVertexAttribL1ui64ARB =
         (PFNGLVERTEXATTRIBL1UI64ARBPROC)(*load)("glVertexAttribL1ui64ARB");
    glad_glVertexAttribL1ui64vARB =
         (PFNGLVERTEXATTRIBL1UI64VARBPROC)(*load)("glVertexAttribL1ui64vARB");
    glad_glGetVertexAttribLui64vARB =
         (PFNGLGETVERTEXATTRIBLUI64VARBPROC)(*load)("glGetVertexAttribLui64vARB");
  }
  bVar16 = GLVersion.minor != 0;
  bVar1 = GLVersion.major != 0;
  return (uint)(bVar16 || bVar1);
LAB_00143f72:
  iVar4 = 1;
  goto LAB_00143f77;
}

Assistant:

int gladLoadGLLoader(GLADloadproc load) {
	GLVersion.major = 0; GLVersion.minor = 0;
	glGetString = (PFNGLGETSTRINGPROC)load("glGetString");
	if(glGetString == NULL) return 0;
	if(glGetString(GL_VERSION) == NULL) return 0;
	find_coreGL();
	load_GL_VERSION_1_0(load);
	load_GL_VERSION_1_1(load);
	load_GL_VERSION_1_2(load);
	load_GL_VERSION_1_3(load);
	load_GL_VERSION_1_4(load);
	load_GL_VERSION_1_5(load);
	load_GL_VERSION_2_0(load);
	load_GL_VERSION_2_1(load);
	load_GL_VERSION_3_0(load);
	load_GL_VERSION_3_1(load);
	load_GL_VERSION_3_2(load);
	load_GL_VERSION_3_3(load);
	load_GL_VERSION_4_0(load);
	load_GL_VERSION_4_1(load);
	load_GL_VERSION_4_2(load);
	load_GL_VERSION_4_3(load);
	load_GL_VERSION_4_4(load);
	load_GL_VERSION_4_5(load);
	load_GL_VERSION_4_6(load);

	if (!find_extensionsGL()) return 0;
	load_GL_ARB_bindless_texture(load);
	return GLVersion.major != 0 || GLVersion.minor != 0;
}